

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

void ncnn::transpose_unpack_output_tile(Mat *topT,Mat *top_blob,int i,int max_ii,int j,int max_jj)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  int iVar18;
  size_t *psVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [64];
  undefined1 (*pauVar26) [32];
  int iVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  undefined1 (*pauVar35) [64];
  undefined8 *puVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  undefined1 (*pauVar40) [16];
  undefined4 *puVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  __m128 tmp0;
  __m128 tmp2;
  __m128 tmp2_1;
  undefined1 auVar98 [32];
  __m128 tmp1;
  __m128 tmp3;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  long local_a0;
  long local_88;
  long local_80;
  long local_58;
  long local_50;
  long local_40;
  
  iVar1 = top_blob->elempack;
  psVar19 = (size_t *)&top_blob->w;
  if (top_blob->dims == 3) {
    psVar19 = &top_blob->cstep;
  }
  iVar2 = (int)*psVar19;
  pauVar35 = (undefined1 (*) [64])topT->data;
  uVar44 = 0;
  lVar31 = (long)iVar2;
  lVar47 = (long)i;
  if (0xf < max_ii) {
    iVar17 = iVar2 * 8;
    uVar33 = j + 7;
    iVar18 = j + 0xf;
    if (-1 < j) {
      uVar33 = j;
      iVar18 = j;
    }
    iVar27 = j % 0x10;
    lVar28 = (long)(iVar2 * 0x10);
    lVar39 = lVar28 * 4;
    lVar30 = (long)iVar17 * 4;
    lVar32 = lVar47 * 0x10 + (long)(iVar2 * j) * 4 + 0xc0;
    lVar46 = (long)(iVar2 * j) * 4 + lVar47 * 4;
    uVar23 = 0;
    do {
      if (iVar1 == 0x10) {
        pauVar25 = (undefined1 (*) [64])
                   ((long)top_blob->data +
                   (uVar23 + lVar47) * 0x40 + (long)((iVar18 >> 4) * iVar2 * 0x10) * 4);
        iVar22 = 0;
        if (iVar27 == 4) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          if (max_jj < 5) {
            auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar78._0_16_;
            *(undefined1 (*) [16])(pauVar25[1] + 0x10) = auVar74._0_16_;
            *(undefined1 (*) [16])(pauVar25[2] + 0x10) = auVar76._0_16_;
            *(undefined1 (*) [16])(pauVar25[3] + 0x10) = auVar75._0_16_;
            auVar48 = vextractf32x4_avx512f(auVar78,1);
            *(undefined1 (*) [16])(pauVar25[2] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,1);
            *(undefined1 (*) [16])(pauVar25[2] + 0x28) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,1);
            *(undefined1 (*) [16])(pauVar25[3] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,1);
            *(undefined1 (*) [16])(pauVar25[3] + 0x28) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,2);
            *(undefined1 (*) [16])(pauVar25[4] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,2);
            *(undefined1 (*) [16])(pauVar25[4] + 0x28) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,2);
            *(undefined1 (*) [16])(pauVar25[5] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,2);
            *(undefined1 (*) [16])(pauVar25[5] + 0x28) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,3);
            *(undefined1 (*) [16])(pauVar25[6] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,3);
            *(undefined1 (*) [16])(pauVar25[6] + 0x28) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,3);
            *(undefined1 (*) [16])(pauVar25[7] + 8) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,3);
            *(undefined1 (*) [16])(pauVar25[7] + 0x28) = auVar48;
            iVar22 = 4;
            lVar20 = 0x100;
          }
          else {
            auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
            auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
            auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
            auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
            auVar82 = vunpcklps_avx512f(pauVar35[8],pauVar35[9]);
            auVar83 = vunpckhps_avx512f(pauVar35[8],pauVar35[9]);
            auVar84 = vunpcklps_avx512f(pauVar35[10],pauVar35[0xb]);
            auVar85 = vunpckhps_avx512f(pauVar35[10],pauVar35[0xb]);
            auVar86 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
            auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
            auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
            auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
            auVar81 = vunpcklpd_avx512f(auVar82,auVar84);
            auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
            auVar84 = vunpcklpd_avx512f(auVar83,auVar85);
            auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
            auVar85 = vshuff64x2_avx512f(auVar86,auVar77,0x88);
            auVar87 = vshuff64x2_avx512f(auVar81,auVar74,0x88);
            auVar88 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
            auVar89 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
            auVar90 = vshuff64x2_avx512f(auVar84,auVar75,0x88);
            auVar91 = vshuff64x2_avx512f(auVar79,auVar83,0x88);
            auVar77 = vshuff64x2_avx512f(auVar86,auVar77,0xdd);
            auVar86 = vshuff64x2_avx512f(auVar81,auVar74,0xdd);
            auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
            auVar80 = vshuff64x2_avx512f(auVar84,auVar75,0xdd);
            auVar79 = vshuff64x2_avx512f(auVar79,auVar83,0xdd);
            auVar82 = vshuff64x2_avx512f(auVar85,auVar87,0x88);
            auVar83 = vshuff64x2_avx512f(auVar88,auVar89,0x88);
            auVar92 = vshuff64x2_avx512f(auVar90,auVar91,0x88);
            auVar93 = vshuff64x2_avx512f(auVar77,auVar86,0x88);
            auVar94 = vshuff64x2_avx512f(auVar78,auVar76,0x88);
            auVar95 = vshuff64x2_avx512f(auVar80,auVar79,0x88);
            auVar85 = vshuff64x2_avx512f(auVar85,auVar87,0xdd);
            auVar87 = vshuff64x2_avx512f(auVar88,auVar89,0xdd);
            auVar88 = vshuff64x2_avx512f(auVar90,auVar91,0xdd);
            auVar77 = vshuff64x2_avx512f(auVar77,auVar86,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar78,auVar76,0xdd);
            auVar78 = vshuff64x2_avx512f(auVar80,auVar79,0xdd);
            *(undefined1 (*) [32])(*pauVar25 + 0x10) = auVar82._0_32_;
            *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar81._0_16_;
            *(undefined1 (*) [16])(pauVar25[1] + 0x10) = auVar74._0_16_;
            *(undefined1 (*) [32])(pauVar25[1] + 0x20) = auVar83._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar83,1);
            *(undefined1 (*) [32])(pauVar25[2] + 0x10) = auVar62;
            *(undefined1 (*) [16])(pauVar25[2] + 0x30) = auVar84._0_16_;
            *(undefined1 (*) [16])(pauVar25[3] + 0x10) = auVar75._0_16_;
            auVar62 = vextractf64x4_avx512f(auVar92,1);
            *(undefined1 (*) [32])(pauVar25[3] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[4] + 0x10) = auVar93._0_32_;
            auVar48 = vextractf32x4_avx512f(auVar81,1);
            *(undefined1 (*) [16])(pauVar25[2] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,1);
            *(undefined1 (*) [16])(pauVar25[2] + 0x28) = auVar48;
            *(undefined1 (*) [32])(pauVar25[5] + 0x20) = auVar94._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar94,1);
            *(undefined1 (*) [32])(pauVar25[6] + 0x10) = auVar62;
            auVar48 = vextractf32x4_avx512f(auVar84,1);
            *(undefined1 (*) [16])(pauVar25[3] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,1);
            *(undefined1 (*) [16])(pauVar25[3] + 0x28) = auVar48;
            auVar62 = vextractf64x4_avx512f(auVar95,1);
            *(undefined1 (*) [32])(pauVar25[7] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[8] + 0x10) = auVar85._0_32_;
            auVar48 = vextractf32x4_avx512f(auVar81,2);
            *(undefined1 (*) [16])(pauVar25[4] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,2);
            *(undefined1 (*) [16])(pauVar25[4] + 0x28) = auVar48;
            *(undefined1 (*) [32])(pauVar25[9] + 0x20) = auVar87._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar87,1);
            *(undefined1 (*) [32])(pauVar25[10] + 0x10) = auVar62;
            auVar48 = vextractf32x4_avx512f(auVar84,2);
            *(undefined1 (*) [16])(pauVar25[5] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,2);
            *(undefined1 (*) [16])(pauVar25[5] + 0x28) = auVar48;
            auVar62 = vextractf64x4_avx512f(auVar88,1);
            *(undefined1 (*) [32])(pauVar25[0xb] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[0xc] + 0x10) = auVar77._0_32_;
            auVar48 = vextractf32x4_avx512f(auVar81,3);
            *(undefined1 (*) [16])(pauVar25[6] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,3);
            *(undefined1 (*) [16])(pauVar25[6] + 0x28) = auVar48;
            *(undefined1 (*) [32])(pauVar25[0xd] + 0x20) = auVar76._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar76,1);
            *(undefined1 (*) [32])(pauVar25[0xe] + 0x10) = auVar62;
            auVar48 = vextractf32x4_avx512f(auVar84,3);
            *(undefined1 (*) [16])(pauVar25[7] + 0x18) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,3);
            *(undefined1 (*) [16])(pauVar25[7] + 0x28) = auVar48;
            auVar62 = vextractf64x4_avx512f(auVar78,1);
            *(undefined1 (*) [32])(pauVar25[0xf] + 0x20) = auVar62;
            iVar22 = 0xc;
            lVar20 = 0x300;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar20);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar28 * 4);
        }
        if (iVar27 == 8) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          if (max_jj < 5) {
            auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            *(undefined1 (*) [16])(*pauVar25 + 0x20) = auVar78._0_16_;
            *(undefined1 (*) [16])(pauVar25[1] + 0x20) = auVar74._0_16_;
            *(undefined1 (*) [16])(pauVar25[2] + 0x20) = auVar76._0_16_;
            *(undefined1 (*) [16])(pauVar25[3] + 0x20) = auVar75._0_16_;
            auVar48 = vextractf32x4_avx512f(auVar78,1);
            *(undefined1 (*) [16])(pauVar25[2] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,1);
            *(undefined1 (*) [16])(pauVar25[2] + 0x30) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,1);
            *(undefined1 (*) [16])(pauVar25[3] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,1);
            *(undefined1 (*) [16])(pauVar25[3] + 0x30) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,2);
            *(undefined1 (*) [16])(pauVar25[4] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,2);
            *(undefined1 (*) [16])(pauVar25[4] + 0x30) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,2);
            *(undefined1 (*) [16])(pauVar25[5] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,2);
            *(undefined1 (*) [16])(pauVar25[5] + 0x30) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,3);
            *(undefined1 (*) [16])(pauVar25[6] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,3);
            *(undefined1 (*) [16])(pauVar25[6] + 0x30) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,3);
            *(undefined1 (*) [16])(pauVar25[7] + 0x10) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,3);
            *(undefined1 (*) [16])(pauVar25[7] + 0x30) = auVar48;
            iVar42 = 4;
            lVar20 = 0x100;
          }
          else {
            auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
            auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
            auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
            auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
            auVar82 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
            auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
            auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
            auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
            auVar81 = vshuff64x2_avx512f(auVar82,auVar77,0x88);
            auVar83 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
            auVar84 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
            auVar85 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
            auVar77 = vshuff64x2_avx512f(auVar82,auVar77,0xdd);
            auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
            auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
            auVar78 = vshuff64x2_avx512f(auVar81,auVar83,0x88);
            auVar79 = vshuff64x2_avx512f(auVar84,auVar85,0x88);
            auVar80 = vshuff64x2_avx512f(auVar77,auVar74,0x88);
            auVar82 = vshuff64x2_avx512f(auVar76,auVar75,0x88);
            auVar81 = vshuff64x2_avx512f(auVar81,auVar83,0xdd);
            auVar83 = vshuff64x2_avx512f(auVar84,auVar85,0xdd);
            auVar74 = vshuff64x2_avx512f(auVar77,auVar74,0xdd);
            auVar75 = vshuff64x2_avx512f(auVar76,auVar75,0xdd);
            *(undefined1 (*) [32])(*pauVar25 + 0x20) = auVar78._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar78,1);
            *(undefined1 (*) [32])(pauVar25[1] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[2] + 0x20) = auVar79._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar79,1);
            *(undefined1 (*) [32])(pauVar25[3] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[4] + 0x20) = auVar80._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar80,1);
            *(undefined1 (*) [32])(pauVar25[5] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[6] + 0x20) = auVar82._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar82,1);
            *(undefined1 (*) [32])(pauVar25[7] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[8] + 0x20) = auVar81._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar81,1);
            *(undefined1 (*) [32])(pauVar25[9] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[10] + 0x20) = auVar83._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar83,1);
            *(undefined1 (*) [32])(pauVar25[0xb] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[0xc] + 0x20) = auVar74._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar74,1);
            *(undefined1 (*) [32])(pauVar25[0xd] + 0x20) = auVar62;
            *(undefined1 (*) [32])(pauVar25[0xe] + 0x20) = auVar75._0_32_;
            auVar62 = vextractf64x4_avx512f(auVar75,1);
            *(undefined1 (*) [32])(pauVar25[0xf] + 0x20) = auVar62;
            iVar42 = 8;
            lVar20 = 0x200;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar20);
          iVar22 = iVar22 + iVar42;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar28 * 4);
        }
        if (iVar27 == 0xc) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar78._0_16_;
          *(undefined1 (*) [16])(pauVar25[1] + 0x30) = auVar74._0_16_;
          *(undefined1 (*) [16])(pauVar25[2] + 0x30) = auVar76._0_16_;
          *(undefined1 (*) [16])(pauVar25[3] + 0x30) = auVar75._0_16_;
          auVar48 = vextractf32x4_avx512f(auVar78,1);
          *(undefined1 (*) [16])(pauVar25[2] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,1);
          *(undefined1 (*) [16])(pauVar25[2] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,1);
          *(undefined1 (*) [16])(pauVar25[3] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,1);
          *(undefined1 (*) [16])(pauVar25[3] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar78,2);
          *(undefined1 (*) [16])(pauVar25[4] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,2);
          *(undefined1 (*) [16])(pauVar25[4] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,2);
          *(undefined1 (*) [16])(pauVar25[5] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,2);
          *(undefined1 (*) [16])(pauVar25[5] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar78,3);
          *(undefined1 (*) [16])(pauVar25[6] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,3);
          *(undefined1 (*) [16])(pauVar25[6] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,3);
          *(undefined1 (*) [16])(pauVar25[7] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,3);
          *(undefined1 (*) [16])(pauVar25[7] + 0x38) = auVar48;
          pauVar35 = pauVar35 + 4;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar28 * 4);
          iVar22 = iVar22 + 4;
        }
        iVar42 = iVar22 + 0xf;
        while (iVar42 < max_jj) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
          auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
          auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
          auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
          auVar82 = vunpcklps_avx512f(pauVar35[8],pauVar35[9]);
          auVar83 = vunpckhps_avx512f(pauVar35[8],pauVar35[9]);
          auVar84 = vunpcklps_avx512f(pauVar35[10],pauVar35[0xb]);
          auVar85 = vunpckhps_avx512f(pauVar35[10],pauVar35[0xb]);
          auVar86 = vunpcklps_avx512f(pauVar35[0xc],pauVar35[0xd]);
          auVar87 = vunpckhps_avx512f(pauVar35[0xc],pauVar35[0xd]);
          auVar88 = vunpcklps_avx512f(pauVar35[0xe],pauVar35[0xf]);
          auVar89 = vunpckhps_avx512f(pauVar35[0xe],pauVar35[0xf]);
          auVar90 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
          auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
          auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
          auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
          auVar81 = vunpcklpd_avx512f(auVar82,auVar84);
          auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
          auVar84 = vunpcklpd_avx512f(auVar83,auVar85);
          auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
          auVar85 = vunpcklpd_avx512f(auVar86,auVar88);
          auVar86 = vunpckhpd_avx512f(auVar86,auVar88);
          auVar88 = vunpcklpd_avx512f(auVar87,auVar89);
          auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
          auVar89 = vshuff64x2_avx512f(auVar90,auVar77,0x88);
          auVar91 = vshuff64x2_avx512f(auVar81,auVar85,0x88);
          auVar92 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
          auVar93 = vshuff64x2_avx512f(auVar82,auVar86,0x88);
          auVar94 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
          auVar95 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
          auVar96 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
          auVar97 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
          auVar77 = vshuff64x2_avx512f(auVar90,auVar77,0xdd);
          auVar81 = vshuff64x2_avx512f(auVar81,auVar85,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar82,auVar86,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
          auVar80 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
          auVar79 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
          auVar82 = vshuff64x2_avx512f(auVar89,auVar91,0x88);
          auVar83 = vshuff64x2_avx512f(auVar92,auVar93,0x88);
          auVar84 = vshuff64x2_avx512f(auVar94,auVar95,0x88);
          auVar85 = vshuff64x2_avx512f(auVar96,auVar97,0x88);
          auVar86 = vshuff64x2_avx512f(auVar77,auVar81,0x88);
          auVar87 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
          auVar88 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
          auVar90 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
          auVar89 = vshuff64x2_avx512f(auVar89,auVar91,0xdd);
          auVar91 = vshuff64x2_avx512f(auVar92,auVar93,0xdd);
          auVar92 = vshuff64x2_avx512f(auVar94,auVar95,0xdd);
          auVar93 = vshuff64x2_avx512f(auVar96,auVar97,0xdd);
          auVar77 = vshuff64x2_avx512f(auVar77,auVar81,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
          *pauVar25 = auVar82;
          pauVar25[1] = auVar83;
          pauVar25[2] = auVar84;
          pauVar25[3] = auVar85;
          pauVar25[4] = auVar86;
          pauVar25[5] = auVar87;
          pauVar25[6] = auVar88;
          pauVar25[7] = auVar90;
          pauVar25[8] = auVar89;
          pauVar25[9] = auVar91;
          pauVar25[10] = auVar92;
          pauVar25[0xb] = auVar93;
          pauVar25[0xc] = auVar77;
          pauVar25[0xd] = auVar74;
          pauVar25[0xe] = auVar76;
          pauVar25[0xf] = auVar75;
          pauVar35 = pauVar35 + 0x10;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar39);
          iVar42 = iVar22 + 0x1f;
          iVar22 = iVar22 + 0x10;
        }
        iVar42 = iVar22 + 0xb;
        while (iVar42 < max_jj) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
          auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
          auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
          auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
          auVar82 = vunpcklps_avx512f(pauVar35[8],pauVar35[9]);
          auVar83 = vunpckhps_avx512f(pauVar35[8],pauVar35[9]);
          auVar84 = vunpcklps_avx512f(pauVar35[10],pauVar35[0xb]);
          auVar85 = vunpckhps_avx512f(pauVar35[10],pauVar35[0xb]);
          auVar86 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
          auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
          auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
          auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
          auVar81 = vunpcklpd_avx512f(auVar82,auVar84);
          auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
          auVar84 = vunpcklpd_avx512f(auVar83,auVar85);
          auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
          auVar85 = vshuff64x2_avx512f(auVar86,auVar77,0x88);
          auVar87 = vshuff64x2_avx512f(auVar81,auVar74,0x88);
          auVar88 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
          auVar89 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
          auVar90 = vshuff64x2_avx512f(auVar84,auVar75,0x88);
          auVar91 = vshuff64x2_avx512f(auVar79,auVar83,0x88);
          auVar77 = vshuff64x2_avx512f(auVar86,auVar77,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar81,auVar74,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
          auVar80 = vshuff64x2_avx512f(auVar84,auVar75,0xdd);
          auVar79 = vshuff64x2_avx512f(auVar79,auVar83,0xdd);
          auVar82 = vshuff64x2_avx512f(auVar85,auVar87,0x88);
          auVar83 = vshuff64x2_avx512f(auVar88,auVar89,0x88);
          auVar92 = vshuff64x2_avx512f(auVar90,auVar91,0x88);
          auVar93 = vshuff64x2_avx512f(auVar77,auVar86,0x88);
          auVar94 = vshuff64x2_avx512f(auVar78,auVar76,0x88);
          auVar95 = vshuff64x2_avx512f(auVar80,auVar79,0x88);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar87,0xdd);
          auVar87 = vshuff64x2_avx512f(auVar88,auVar89,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar90,auVar91,0xdd);
          auVar77 = vshuff64x2_avx512f(auVar77,auVar86,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar78,auVar76,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar80,auVar79,0xdd);
          *(undefined1 (*) [32])*pauVar25 = auVar82._0_32_;
          *(undefined1 (*) [16])(*pauVar25 + 0x20) = auVar81._0_16_;
          *(undefined1 (*) [16])pauVar25[1] = auVar74._0_16_;
          *(undefined1 (*) [32])(pauVar25[1] + 0x10) = auVar83._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar83,1);
          *(undefined1 (*) [32])pauVar25[2] = auVar62;
          *(undefined1 (*) [16])(pauVar25[2] + 0x20) = auVar84._0_16_;
          *(undefined1 (*) [16])pauVar25[3] = auVar75._0_16_;
          auVar62 = vextractf64x4_avx512f(auVar92,1);
          *(undefined1 (*) [32])(pauVar25[3] + 0x10) = auVar62;
          *(undefined1 (*) [32])pauVar25[4] = auVar93._0_32_;
          auVar48 = vextractf32x4_avx512f(auVar81,1);
          *(undefined1 (*) [16])(pauVar25[2] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,1);
          *(undefined1 (*) [16])(pauVar25[2] + 0x20) = auVar48;
          *(undefined1 (*) [32])(pauVar25[5] + 0x10) = auVar94._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar94,1);
          *(undefined1 (*) [32])pauVar25[6] = auVar62;
          auVar48 = vextractf32x4_avx512f(auVar84,1);
          *(undefined1 (*) [16])(pauVar25[3] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,1);
          *(undefined1 (*) [16])(pauVar25[3] + 0x20) = auVar48;
          auVar62 = vextractf64x4_avx512f(auVar95,1);
          *(undefined1 (*) [32])(pauVar25[7] + 0x10) = auVar62;
          *(undefined1 (*) [32])pauVar25[8] = auVar85._0_32_;
          auVar48 = vextractf32x4_avx512f(auVar81,2);
          *(undefined1 (*) [16])(pauVar25[4] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,2);
          *(undefined1 (*) [16])(pauVar25[4] + 0x20) = auVar48;
          *(undefined1 (*) [32])(pauVar25[9] + 0x10) = auVar87._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar87,1);
          *(undefined1 (*) [32])pauVar25[10] = auVar62;
          auVar48 = vextractf32x4_avx512f(auVar84,2);
          *(undefined1 (*) [16])(pauVar25[5] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,2);
          *(undefined1 (*) [16])(pauVar25[5] + 0x20) = auVar48;
          auVar62 = vextractf64x4_avx512f(auVar88,1);
          *(undefined1 (*) [32])(pauVar25[0xb] + 0x10) = auVar62;
          *(undefined1 (*) [32])pauVar25[0xc] = auVar77._0_32_;
          auVar48 = vextractf32x4_avx512f(auVar81,3);
          *(undefined1 (*) [16])(pauVar25[6] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,3);
          *(undefined1 (*) [16])(pauVar25[6] + 0x20) = auVar48;
          *(undefined1 (*) [32])(pauVar25[0xd] + 0x10) = auVar76._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar76,1);
          *(undefined1 (*) [32])pauVar25[0xe] = auVar62;
          auVar48 = vextractf32x4_avx512f(auVar84,3);
          *(undefined1 (*) [16])(pauVar25[7] + 0x10) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,3);
          *(undefined1 (*) [16])(pauVar25[7] + 0x20) = auVar48;
          auVar62 = vextractf64x4_avx512f(auVar78,1);
          *(undefined1 (*) [32])(pauVar25[0xf] + 0x10) = auVar62;
          pauVar35 = pauVar35 + 0xc;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar39);
          iVar42 = iVar22 + 0x17;
          iVar22 = iVar22 + 0xc;
        }
        iVar42 = iVar22 + 7;
        while (iVar42 < max_jj) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
          auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
          auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
          auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
          auVar82 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
          auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
          auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
          auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
          auVar81 = vshuff64x2_avx512f(auVar82,auVar77,0x88);
          auVar83 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
          auVar84 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
          auVar85 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
          auVar77 = vshuff64x2_avx512f(auVar82,auVar77,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar81,auVar83,0x88);
          auVar79 = vshuff64x2_avx512f(auVar84,auVar85,0x88);
          auVar80 = vshuff64x2_avx512f(auVar77,auVar74,0x88);
          auVar82 = vshuff64x2_avx512f(auVar76,auVar75,0x88);
          auVar81 = vshuff64x2_avx512f(auVar81,auVar83,0xdd);
          auVar83 = vshuff64x2_avx512f(auVar84,auVar85,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar77,auVar74,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar76,auVar75,0xdd);
          *(undefined1 (*) [32])*pauVar25 = auVar78._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar78,1);
          *(undefined1 (*) [32])pauVar25[1] = auVar62;
          *(undefined1 (*) [32])pauVar25[2] = auVar79._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar79,1);
          *(undefined1 (*) [32])pauVar25[3] = auVar62;
          *(undefined1 (*) [32])pauVar25[4] = auVar80._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar80,1);
          *(undefined1 (*) [32])pauVar25[5] = auVar62;
          *(undefined1 (*) [32])pauVar25[6] = auVar82._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar82,1);
          *(undefined1 (*) [32])pauVar25[7] = auVar62;
          *(undefined1 (*) [32])pauVar25[8] = auVar81._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar81,1);
          *(undefined1 (*) [32])pauVar25[9] = auVar62;
          *(undefined1 (*) [32])pauVar25[10] = auVar83._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar83,1);
          *(undefined1 (*) [32])pauVar25[0xb] = auVar62;
          *(undefined1 (*) [32])pauVar25[0xc] = auVar74._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar74,1);
          *(undefined1 (*) [32])pauVar25[0xd] = auVar62;
          *(undefined1 (*) [32])pauVar25[0xe] = auVar75._0_32_;
          auVar62 = vextractf64x4_avx512f(auVar75,1);
          *(undefined1 (*) [32])pauVar25[0xf] = auVar62;
          pauVar35 = pauVar35 + 8;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar39);
          iVar42 = iVar22 + 0xf;
          iVar22 = iVar22 + 8;
        }
        iVar22 = iVar22 + 3;
        if (iVar22 < max_jj) {
          pauVar25 = pauVar25 + 0xf;
          do {
            auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
            auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
            auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
            auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
            auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            *(undefined1 (*) [16])pauVar25[-0xf] = auVar78._0_16_;
            *(undefined1 (*) [16])pauVar25[-0xe] = auVar74._0_16_;
            *(undefined1 (*) [16])pauVar25[-0xd] = auVar76._0_16_;
            *(undefined1 (*) [16])pauVar25[-0xc] = auVar75._0_16_;
            auVar48 = vextractf32x4_avx512f(auVar78,1);
            *(undefined1 (*) [16])(pauVar25[-6] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,1);
            *(undefined1 (*) [16])pauVar25[-5] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,1);
            *(undefined1 (*) [16])(pauVar25[-5] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,1);
            *(undefined1 (*) [16])pauVar25[-4] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,2);
            *(undefined1 (*) [16])(pauVar25[-4] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,2);
            *(undefined1 (*) [16])pauVar25[-3] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,2);
            *(undefined1 (*) [16])(pauVar25[-3] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,2);
            *(undefined1 (*) [16])pauVar25[-2] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,3);
            *(undefined1 (*) [16])(pauVar25[-2] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,3);
            *(undefined1 (*) [16])pauVar25[-1] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,3);
            *(undefined1 (*) [16])(pauVar25[-1] + 0x20) = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,3);
            *(undefined1 (*) [16])*pauVar25 = auVar48;
            pauVar35 = pauVar35 + 4;
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar39);
            iVar22 = iVar22 + 4;
          } while (iVar22 < max_jj);
        }
      }
      if (iVar1 == 8) {
        pauVar25 = (undefined1 (*) [64])
                   ((long)top_blob->data +
                   (lVar47 + uVar23) * 0x20 + (long)(int)((uVar33 >> 3) * iVar17) * 4);
        uVar24 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar78._0_16_;
          *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar74._0_16_;
          *(undefined1 (*) [16])(pauVar25[1] + 0x10) = auVar76._0_16_;
          *(undefined1 (*) [16])(pauVar25[1] + 0x30) = auVar75._0_16_;
          auVar48 = vextractf32x4_avx512f(auVar78,1);
          *(undefined1 (*) [16])(pauVar25[1] + 8) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,1);
          *(undefined1 (*) [16])(pauVar25[1] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,1);
          *(undefined1 (*) [16])(pauVar25[1] + 0x28) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,1);
          *(undefined1 (*) [16])(pauVar25[1] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar78,2);
          *(undefined1 (*) [16])(pauVar25[2] + 8) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,2);
          *(undefined1 (*) [16])(pauVar25[2] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,2);
          *(undefined1 (*) [16])(pauVar25[2] + 0x28) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,2);
          *(undefined1 (*) [16])(pauVar25[2] + 0x38) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar78,3);
          *(undefined1 (*) [16])(pauVar25[3] + 8) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar74,3);
          *(undefined1 (*) [16])(pauVar25[3] + 0x18) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar76,3);
          *(undefined1 (*) [16])(pauVar25[3] + 0x28) = auVar48;
          auVar48 = vextractf32x4_avx512f(auVar75,3);
          *(undefined1 (*) [16])(pauVar25[3] + 0x38) = auVar48;
          pauVar35 = pauVar35 + 4;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + (long)iVar17 * 4);
          uVar24 = 4;
        }
        iVar22 = uVar24 + 7;
        while (iVar22 < max_jj) {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklps_avx512f(pauVar35[4],pauVar35[5]);
          auVar79 = vunpckhps_avx512f(pauVar35[4],pauVar35[5]);
          auVar80 = vunpcklps_avx512f(pauVar35[6],pauVar35[7]);
          auVar81 = vunpckhps_avx512f(pauVar35[6],pauVar35[7]);
          auVar82 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
          auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
          auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
          auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
          auVar81 = vshuff64x2_avx512f(auVar82,auVar77,0x88);
          auVar83 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
          auVar84 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
          auVar85 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
          auVar77 = vshuff64x2_avx512f(auVar82,auVar77,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar81,auVar83,0x88);
          auVar79 = vshuff64x2_avx512f(auVar84,auVar85,0x88);
          auVar80 = vshuff64x2_avx512f(auVar77,auVar74,0x88);
          auVar82 = vshuff64x2_avx512f(auVar76,auVar75,0x88);
          auVar81 = vshuff64x2_avx512f(auVar81,auVar83,0xdd);
          auVar83 = vshuff64x2_avx512f(auVar84,auVar85,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar77,auVar74,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar76,auVar75,0xdd);
          *pauVar25 = auVar78;
          pauVar25[1] = auVar79;
          pauVar25[2] = auVar80;
          pauVar25[3] = auVar82;
          pauVar25[4] = auVar81;
          pauVar25[5] = auVar83;
          pauVar25[6] = auVar74;
          pauVar25[7] = auVar75;
          pauVar35 = pauVar35 + 8;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar30);
          iVar22 = uVar24 + 0xf;
          uVar24 = uVar24 + 8;
        }
        uVar24 = uVar24 | 3;
        if ((int)uVar24 < max_jj) {
          pauVar40 = (undefined1 (*) [16])(pauVar25[7] + 0x20);
          do {
            auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
            auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
            auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
            auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
            auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
            auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
            auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
            auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
            pauVar40[-0x1e] = auVar78._0_16_;
            pauVar40[-0x1c] = auVar74._0_16_;
            pauVar40[-0x1a] = auVar76._0_16_;
            pauVar40[-0x18] = auVar75._0_16_;
            auVar48 = vextractf32x4_avx512f(auVar78,1);
            pauVar40[-0xb] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,1);
            pauVar40[-10] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,1);
            pauVar40[-9] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,1);
            pauVar40[-8] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,2);
            pauVar40[-7] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,2);
            pauVar40[-6] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,2);
            pauVar40[-5] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,2);
            pauVar40[-4] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar78,3);
            pauVar40[-3] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar74,3);
            pauVar40[-2] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar76,3);
            pauVar40[-1] = auVar48;
            auVar48 = vextractf32x4_avx512f(auVar75,3);
            *pauVar40 = auVar48;
            pauVar35 = pauVar35 + 4;
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar30);
            uVar24 = uVar24 + 4;
          } while ((int)uVar24 < max_jj);
        }
      }
      if (3 < max_jj && iVar1 == 4) {
        pauVar25 = (undefined1 (*) [64])((long)top_blob->data + lVar32);
        iVar22 = 3;
        do {
          auVar74 = vunpcklps_avx512f(*pauVar35,pauVar35[1]);
          auVar75 = vunpckhps_avx512f(*pauVar35,pauVar35[1]);
          auVar76 = vunpcklps_avx512f(pauVar35[2],pauVar35[3]);
          auVar77 = vunpckhps_avx512f(pauVar35[2],pauVar35[3]);
          auVar78 = vunpcklpd_avx512f(auVar74,auVar76);
          auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
          auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
          auVar77 = vshuff64x2_avx512f(auVar78,auVar74,0x88);
          auVar79 = vshuff64x2_avx512f(auVar76,auVar75,0x88);
          auVar74 = vshuff64x2_avx512f(auVar78,auVar74,0xdd);
          auVar75 = vshuff64x2_avx512f(auVar76,auVar75,0xdd);
          auVar76 = vshuff64x2_avx512f(auVar77,auVar79,0x88);
          auVar78 = vshuff64x2_avx512f(auVar74,auVar75,0x88);
          auVar77 = vshuff64x2_avx512f(auVar77,auVar79,0xdd);
          auVar74 = vshuff64x2_avx512f(auVar74,auVar75,0xdd);
          pauVar25[-3] = auVar76;
          pauVar25[-2] = auVar78;
          pauVar25[-1] = auVar77;
          *pauVar25 = auVar74;
          pauVar35 = pauVar35 + 4;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + (long)(iVar2 * 4) * 4);
          iVar22 = iVar22 + 4;
        } while (iVar22 < max_jj);
      }
      if (0 < max_jj && iVar1 == 1) {
        pauVar25 = (undefined1 (*) [64])((long)top_blob->data + lVar46);
        iVar22 = max_jj;
        do {
          *pauVar25 = *pauVar35;
          pauVar35 = pauVar35 + 1;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31 * 4);
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      uVar44 = uVar23 + 0x10;
      uVar29 = uVar23 + 0x1f;
      lVar32 = lVar32 + 0x100;
      lVar46 = lVar46 + 0x40;
      uVar23 = uVar44;
    } while (uVar29 < (uint)max_ii);
  }
  lVar46 = (long)max_ii;
  if ((int)((uint)uVar44 | 7) < max_ii) {
    iVar18 = iVar2 * 8;
    uVar24 = j + 7;
    uVar33 = j + 0xf;
    if (-1 < j) {
      uVar24 = j;
      uVar33 = j;
    }
    iVar17 = j - (uVar33 & 0xfffffff0);
    lVar32 = (long)(iVar2 * 0x10);
    uVar23 = uVar44 & 0xffffffff;
    lVar30 = lVar32 * 4;
    lVar28 = (long)iVar18 * 4;
    lVar20 = (lVar47 + uVar23) * 0x10 + (long)(iVar2 * j) * 4 + 0x60;
    lVar39 = (long)(iVar2 * j) * 4 + lVar47 * 4 + uVar23 * 4;
    do {
      if (iVar1 == 0x10) {
        pauVar26 = (undefined1 (*) [32])
                   ((long)top_blob->data +
                   (lVar47 + uVar23) * 0x40 + (long)(((int)uVar33 >> 4) * iVar2 * 0x10) * 4);
        iVar27 = 0;
        if (iVar17 == 4) {
          auVar98 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar62 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar9 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          if (max_jj < 5) {
            auVar7 = vunpcklpd_avx(auVar98,auVar9);
            auVar98 = vunpckhpd_avx(auVar98,auVar9);
            auVar9 = vunpcklpd_avx(auVar62,auVar6);
            auVar62 = vunpckhpd_avx(auVar62,auVar6);
            *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar7._0_16_;
            *(undefined1 (*) [16])(pauVar26[2] + 0x10) = auVar98._0_16_;
            *(undefined1 (*) [16])(pauVar26[4] + 0x10) = auVar9._0_16_;
            *(undefined1 (*) [16])(pauVar26[6] + 0x10) = auVar62._0_16_;
            *(undefined1 (*) [16])(pauVar26[8] + 0x10) = auVar7._16_16_;
            *(undefined1 (*) [16])(pauVar26[10] + 0x10) = auVar98._16_16_;
            *(undefined1 (*) [16])(pauVar26[0xc] + 0x10) = auVar9._16_16_;
            *(undefined1 (*) [16])(pauVar26[0xe] + 0x10) = auVar62._16_16_;
            iVar27 = 4;
            lVar21 = 0x80;
          }
          else {
            auVar104 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                     *(undefined1 (*) [32])(pauVar35[2] + 0x20));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                   *(undefined1 (*) [32])(pauVar35[2] + 0x20));
            auVar107 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                     *(undefined1 (*) [32])(pauVar35[3] + 0x20));
            auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                     *(undefined1 (*) [32])(pauVar35[3] + 0x20));
            auVar105 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[4],
                                     *(undefined1 (*) [32])(pauVar35[4] + 0x20));
            auVar99 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[4],
                                    *(undefined1 (*) [32])(pauVar35[4] + 0x20));
            auVar66 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[5],
                                    *(undefined1 (*) [32])(pauVar35[5] + 0x20));
            auVar103 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[5],
                                     *(undefined1 (*) [32])(pauVar35[5] + 0x20));
            auVar8 = vunpcklpd_avx(auVar98,auVar9);
            auVar98 = vunpckhpd_avx(auVar98,auVar9);
            auVar73 = vunpcklpd_avx(auVar62,auVar6);
            auVar62 = vunpckhpd_avx(auVar62,auVar6);
            auVar101 = vunpcklpd_avx(auVar104,auVar107);
            auVar6 = vunpckhpd_avx(auVar104,auVar107);
            auVar104 = vunpcklpd_avx(auVar7,auVar100);
            auVar9 = vunpckhpd_avx(auVar7,auVar100);
            auVar107 = vunpcklpd_avx(auVar105,auVar66);
            auVar7 = vunpckhpd_avx(auVar105,auVar66);
            auVar105 = vunpcklpd_avx(auVar99,auVar103);
            auVar100 = vunpckhpd_avx(auVar99,auVar103);
            auVar103._16_16_ = auVar101._0_16_;
            auVar103._0_16_ = auVar8._0_16_;
            auVar66._16_16_ = auVar7._0_16_;
            auVar66._0_16_ = auVar6._0_16_;
            auVar63._16_16_ = auVar104._0_16_;
            auVar63._0_16_ = auVar73._0_16_;
            auVar64._16_16_ = auVar100._0_16_;
            auVar64._0_16_ = auVar9._0_16_;
            auVar99 = vperm2f128_avx(auVar8,auVar101,0x31);
            auVar6 = vperm2f128_avx(auVar6,auVar7,0x31);
            auVar7 = vperm2f128_avx(auVar73,auVar104,0x31);
            auVar9 = vperm2f128_avx(auVar9,auVar100,0x31);
            *(undefined1 (*) [32])(*pauVar26 + 0x10) = auVar103;
            *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar107._0_16_;
            *(undefined1 (*) [16])(pauVar26[2] + 0x10) = auVar98._0_16_;
            pauVar26[3] = auVar66;
            *(undefined1 (*) [32])(pauVar26[4] + 0x10) = auVar63;
            *(undefined1 (*) [16])(pauVar26[5] + 0x10) = auVar105._0_16_;
            *(undefined1 (*) [16])(pauVar26[6] + 0x10) = auVar62._0_16_;
            pauVar26[7] = auVar64;
            *(undefined1 (*) [32])(pauVar26[8] + 0x10) = auVar99;
            *(undefined1 (*) [16])(pauVar26[9] + 0x10) = auVar107._16_16_;
            *(undefined1 (*) [16])(pauVar26[10] + 0x10) = auVar98._16_16_;
            pauVar26[0xb] = auVar6;
            *(undefined1 (*) [32])(pauVar26[0xc] + 0x10) = auVar7;
            *(undefined1 (*) [16])(pauVar26[0xd] + 0x10) = auVar105._16_16_;
            *(undefined1 (*) [16])(pauVar26[0xe] + 0x10) = auVar62._16_16_;
            pauVar26[0xf] = auVar9;
            iVar27 = 0xc;
            lVar21 = 0x180;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar21);
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar32 * 4);
        }
        if (iVar17 == 8) {
          auVar98 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar62 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar9 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          if (max_jj < 5) {
            auVar7 = vunpcklpd_avx(auVar98,auVar9);
            auVar98 = vunpckhpd_avx(auVar98,auVar9);
            auVar9 = vunpcklpd_avx(auVar62,auVar6);
            auVar62 = vunpckhpd_avx(auVar62,auVar6);
            *(undefined1 (*) [16])pauVar26[1] = auVar7._0_16_;
            *(undefined1 (*) [16])pauVar26[3] = auVar98._0_16_;
            *(undefined1 (*) [16])pauVar26[5] = auVar9._0_16_;
            *(undefined1 (*) [16])pauVar26[7] = auVar62._0_16_;
            *(undefined1 (*) [16])pauVar26[9] = auVar7._16_16_;
            *(undefined1 (*) [16])pauVar26[0xb] = auVar98._16_16_;
            *(undefined1 (*) [16])pauVar26[0xd] = auVar9._16_16_;
            *(undefined1 (*) [16])pauVar26[0xf] = auVar62._16_16_;
            iVar22 = 4;
            lVar21 = 0x80;
          }
          else {
            auVar73 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                    *(undefined1 (*) [32])(pauVar35[2] + 0x20));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                   *(undefined1 (*) [32])(pauVar35[2] + 0x20));
            auVar101 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                     *(undefined1 (*) [32])(pauVar35[3] + 0x20));
            auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                     *(undefined1 (*) [32])(pauVar35[3] + 0x20));
            auVar99 = vunpcklpd_avx(auVar98,auVar9);
            auVar98 = vunpckhpd_avx(auVar98,auVar9);
            auVar103 = vunpcklpd_avx(auVar62,auVar6);
            auVar62 = vunpckhpd_avx(auVar62,auVar6);
            auVar8 = vunpcklpd_avx(auVar73,auVar101);
            auVar6 = vunpckhpd_avx(auVar73,auVar101);
            auVar73 = vunpcklpd_avx(auVar7,auVar100);
            auVar9 = vunpckhpd_avx(auVar7,auVar100);
            auVar100._16_16_ = auVar8._0_16_;
            auVar100._0_16_ = auVar99._0_16_;
            auVar101._16_16_ = auVar6._0_16_;
            auVar101._0_16_ = auVar98._0_16_;
            auVar104._16_16_ = auVar73._0_16_;
            auVar104._0_16_ = auVar103._0_16_;
            auVar107._16_16_ = auVar9._0_16_;
            auVar107._0_16_ = auVar62._0_16_;
            auVar7 = vperm2f128_avx(auVar99,auVar8,0x31);
            auVar6 = vperm2f128_avx(auVar98,auVar6,0x31);
            auVar98 = vperm2f128_avx(auVar103,auVar73,0x31);
            auVar62 = vperm2f128_avx(auVar62,auVar9,0x31);
            pauVar26[1] = auVar100;
            pauVar26[3] = auVar101;
            pauVar26[5] = auVar104;
            pauVar26[7] = auVar107;
            pauVar26[9] = auVar7;
            pauVar26[0xb] = auVar6;
            pauVar26[0xd] = auVar98;
            pauVar26[0xf] = auVar62;
            iVar22 = 8;
            lVar21 = 0x100;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar21);
          iVar27 = iVar27 + iVar22;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar32 * 4);
        }
        if (iVar17 == 0xc) {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar9 = vunpcklpd_avx(auVar62,auVar7);
          auVar62 = vunpckhpd_avx(auVar62,auVar7);
          auVar7 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar9._0_16_;
          *(undefined1 (*) [16])(pauVar26[3] + 0x10) = auVar62._0_16_;
          *(undefined1 (*) [16])(pauVar26[5] + 0x10) = auVar7._0_16_;
          *(undefined1 (*) [16])(pauVar26[7] + 0x10) = auVar6._0_16_;
          *(undefined1 (*) [16])(pauVar26[9] + 0x10) = auVar9._16_16_;
          *(undefined1 (*) [16])(pauVar26[0xb] + 0x10) = auVar62._16_16_;
          *(undefined1 (*) [16])(pauVar26[0xd] + 0x10) = auVar7._16_16_;
          *(undefined1 (*) [16])(pauVar26[0xf] + 0x10) = auVar6._16_16_;
          pauVar35 = pauVar35 + 2;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar32 * 4);
          iVar27 = iVar27 + 4;
        }
        iVar22 = iVar27 + 0xf;
        while (iVar22 < max_jj) {
          auVar63 = vunpcklps_avx512vl(*(undefined1 (*) [32])*pauVar35,
                                       *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar62 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar73 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                  *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                  *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar101 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                   *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                 *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar104 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[4],
                                   *(undefined1 (*) [32])(pauVar35[4] + 0x20));
          auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[4],
                                 *(undefined1 (*) [32])(pauVar35[4] + 0x20));
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[5],
                                   *(undefined1 (*) [32])(pauVar35[5] + 0x20));
          auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[5],
                                   *(undefined1 (*) [32])(pauVar35[5] + 0x20));
          auVar105 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[6],
                                   *(undefined1 (*) [32])(pauVar35[6] + 0x20));
          auVar99 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[6],
                                  *(undefined1 (*) [32])(pauVar35[6] + 0x20));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[7],
                                  *(undefined1 (*) [32])(pauVar35[7] + 0x20));
          auVar103 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[7],
                                   *(undefined1 (*) [32])(pauVar35[7] + 0x20));
          auVar64 = vunpcklpd_avx512vl(auVar63,auVar8);
          auVar63 = vunpckhpd_avx512vl(auVar63,auVar8);
          auVar65 = vunpcklpd_avx512vl(auVar62,auVar6);
          auVar62 = vunpckhpd_avx(auVar62,auVar6);
          auVar8 = vunpcklpd_avx(auVar73,auVar101);
          auVar6 = vunpckhpd_avx(auVar73,auVar101);
          auVar73 = vunpcklpd_avx(auVar98,auVar9);
          auVar98 = vunpckhpd_avx(auVar98,auVar9);
          auVar101 = vunpcklpd_avx(auVar104,auVar107);
          auVar9 = vunpckhpd_avx(auVar104,auVar107);
          auVar104 = vunpcklpd_avx(auVar7,auVar100);
          auVar7 = vunpckhpd_avx(auVar7,auVar100);
          auVar107 = vunpcklpd_avx(auVar105,auVar66);
          auVar100 = vunpckhpd_avx(auVar105,auVar66);
          auVar105 = vunpcklpd_avx(auVar99,auVar103);
          auVar99 = vunpckhpd_avx(auVar99,auVar103);
          auVar109._16_16_ = auVar8._0_16_;
          auVar109._0_16_ = auVar64._0_16_;
          auVar66 = vinsertf32x4_avx512vl(auVar101,auVar107._0_16_,1);
          auVar67 = vinsertf32x4_avx512vl(auVar63,auVar6._0_16_,1);
          auVar68 = vinsertf32x4_avx512vl(auVar9,auVar100._0_16_,1);
          auVar69 = vinsertf32x4_avx512vl(auVar65,auVar73._0_16_,1);
          auVar70 = vinsertf32x4_avx512vl(auVar104,auVar105._0_16_,1);
          auVar71 = vinsertf32x4_avx512vl(auVar62,auVar98._0_16_,1);
          auVar72 = vinsertf32x4_avx512vl(auVar7,auVar99._0_16_,1);
          auVar103 = vperm2f128_avx(auVar64,auVar8,0x31);
          auVar8 = vperm2f128_avx(auVar101,auVar107,0x31);
          auVar6 = vperm2f128_avx(auVar63,auVar6,0x31);
          auVar9 = vperm2f128_avx(auVar9,auVar100,0x31);
          auVar73 = vshuff64x2_avx512vl(auVar65,auVar73,3);
          auVar100 = vperm2f128_avx(auVar104,auVar105,0x31);
          auVar62 = vperm2f128_avx(auVar62,auVar98,0x31);
          auVar98 = vperm2f128_avx(auVar7,auVar99,0x31);
          *pauVar26 = auVar109;
          pauVar26[1] = auVar66;
          pauVar26[2] = auVar67;
          pauVar26[3] = auVar68;
          pauVar26[4] = auVar69;
          pauVar26[5] = auVar70;
          pauVar26[6] = auVar71;
          pauVar26[7] = auVar72;
          pauVar26[8] = auVar103;
          pauVar26[9] = auVar8;
          pauVar26[10] = auVar6;
          pauVar26[0xb] = auVar9;
          pauVar26[0xc] = auVar73;
          pauVar26[0xd] = auVar100;
          pauVar26[0xe] = auVar62;
          pauVar26[0xf] = auVar98;
          pauVar35 = pauVar35 + 8;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar30);
          iVar22 = iVar27 + 0x1f;
          iVar27 = iVar27 + 0x10;
        }
        iVar22 = iVar27 + 0xb;
        while (iVar22 < max_jj) {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar101 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                   *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                 *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar104 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                   *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                 *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[4],
                                   *(undefined1 (*) [32])(pauVar35[4] + 0x20));
          auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[4],
                                   *(undefined1 (*) [32])(pauVar35[4] + 0x20));
          auVar105 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[5],
                                   *(undefined1 (*) [32])(pauVar35[5] + 0x20));
          auVar99 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[5],
                                  *(undefined1 (*) [32])(pauVar35[5] + 0x20));
          auVar103 = vunpcklpd_avx(auVar62,auVar8);
          auVar62 = vunpckhpd_avx(auVar62,auVar8);
          auVar8 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          auVar73 = vunpcklpd_avx(auVar101,auVar104);
          auVar98 = vunpckhpd_avx(auVar101,auVar104);
          auVar101 = vunpcklpd_avx(auVar9,auVar7);
          auVar9 = vunpckhpd_avx(auVar9,auVar7);
          auVar104 = vunpcklpd_avx(auVar107,auVar105);
          auVar7 = vunpckhpd_avx(auVar107,auVar105);
          auVar107 = vunpcklpd_avx(auVar100,auVar99);
          auVar100 = vunpckhpd_avx(auVar100,auVar99);
          auVar105._16_16_ = auVar73._0_16_;
          auVar105._0_16_ = auVar103._0_16_;
          auVar65._16_16_ = auVar7._0_16_;
          auVar65._0_16_ = auVar98._0_16_;
          auVar67._16_16_ = auVar101._0_16_;
          auVar67._0_16_ = auVar8._0_16_;
          auVar68._16_16_ = auVar100._0_16_;
          auVar68._0_16_ = auVar9._0_16_;
          auVar99 = vperm2f128_avx(auVar103,auVar73,0x31);
          auVar98 = vperm2f128_avx(auVar98,auVar7,0x31);
          auVar7 = vperm2f128_avx(auVar8,auVar101,0x31);
          auVar9 = vperm2f128_avx(auVar9,auVar100,0x31);
          *pauVar26 = auVar105;
          *(undefined1 (*) [16])pauVar26[1] = auVar104._0_16_;
          *(undefined1 (*) [16])pauVar26[2] = auVar62._0_16_;
          *(undefined1 (*) [32])(pauVar26[2] + 0x10) = auVar65;
          pauVar26[4] = auVar67;
          *(undefined1 (*) [16])pauVar26[5] = auVar107._0_16_;
          *(undefined1 (*) [16])pauVar26[6] = auVar6._0_16_;
          *(undefined1 (*) [32])(pauVar26[6] + 0x10) = auVar68;
          pauVar26[8] = auVar99;
          *(undefined1 (*) [16])pauVar26[9] = auVar104._16_16_;
          *(undefined1 (*) [16])pauVar26[10] = auVar62._16_16_;
          *(undefined1 (*) [32])(pauVar26[10] + 0x10) = auVar98;
          pauVar26[0xc] = auVar7;
          *(undefined1 (*) [16])pauVar26[0xd] = auVar107._16_16_;
          *(undefined1 (*) [16])pauVar26[0xe] = auVar6._16_16_;
          *(undefined1 (*) [32])(pauVar26[0xe] + 0x10) = auVar9;
          pauVar35 = pauVar35 + 6;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar30);
          iVar22 = iVar27 + 0x17;
          iVar27 = iVar27 + 0xc;
        }
        iVar22 = iVar27 + 7;
        while (iVar22 < max_jj) {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar99 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                 *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                 *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar73 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                  *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                 *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar100 = vunpcklpd_avx(auVar62,auVar99);
          auVar62 = vunpckhpd_avx(auVar62,auVar99);
          auVar99 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          auVar103 = vunpcklpd_avx(auVar8,auVar73);
          auVar98 = vunpckhpd_avx(auVar8,auVar73);
          auVar8 = vunpcklpd_avx(auVar9,auVar7);
          auVar9 = vunpckhpd_avx(auVar9,auVar7);
          auVar73._16_16_ = auVar103._0_16_;
          auVar73._0_16_ = auVar100._0_16_;
          auVar69._16_16_ = auVar98._0_16_;
          auVar69._0_16_ = auVar62._0_16_;
          auVar70._16_16_ = auVar8._0_16_;
          auVar70._0_16_ = auVar99._0_16_;
          auVar71._16_16_ = auVar9._0_16_;
          auVar71._0_16_ = auVar6._0_16_;
          auVar7 = vperm2f128_avx(auVar100,auVar103,0x31);
          auVar62 = vperm2f128_avx(auVar62,auVar98,0x31);
          auVar98 = vperm2f128_avx(auVar99,auVar8,0x31);
          auVar6 = vperm2f128_avx(auVar6,auVar9,0x31);
          *pauVar26 = auVar73;
          pauVar26[2] = auVar69;
          pauVar26[4] = auVar70;
          pauVar26[6] = auVar71;
          pauVar26[8] = auVar7;
          pauVar26[10] = auVar62;
          pauVar26[0xc] = auVar98;
          pauVar26[0xe] = auVar6;
          pauVar35 = pauVar35 + 4;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar30);
          iVar22 = iVar27 + 0xf;
          iVar27 = iVar27 + 8;
        }
        iVar27 = iVar27 + 3;
        if (iVar27 < max_jj) {
          pauVar26 = pauVar26 + 0xe;
          do {
            auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                    *(undefined1 (*) [32])(*pauVar35 + 0x20));
            auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                   *(undefined1 (*) [32])(*pauVar35 + 0x20));
            auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                   *(undefined1 (*) [32])(pauVar35[1] + 0x20));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                    *(undefined1 (*) [32])(pauVar35[1] + 0x20));
            auVar9 = vunpcklpd_avx(auVar62,auVar7);
            auVar62 = vunpckhpd_avx(auVar62,auVar7);
            auVar7 = vunpcklpd_avx(auVar6,auVar98);
            auVar6 = vunpckhpd_avx(auVar6,auVar98);
            *(undefined1 (*) [16])pauVar26[-0xe] = auVar9._0_16_;
            *(undefined1 (*) [16])pauVar26[-0xc] = auVar62._0_16_;
            *(undefined1 (*) [16])pauVar26[-10] = auVar7._0_16_;
            *(undefined1 (*) [16])pauVar26[-8] = auVar6._0_16_;
            *(undefined1 (*) [16])pauVar26[-6] = auVar9._16_16_;
            *(undefined1 (*) [16])pauVar26[-4] = auVar62._16_16_;
            *(undefined1 (*) [16])pauVar26[-2] = auVar7._16_16_;
            *(undefined1 (*) [16])*pauVar26 = auVar6._16_16_;
            pauVar35 = pauVar35 + 2;
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar30);
            iVar27 = iVar27 + 4;
          } while (iVar27 < max_jj);
        }
      }
      if (iVar1 == 8) {
        pauVar26 = (undefined1 (*) [32])
                   ((long)top_blob->data +
                   (lVar47 + uVar23) * 0x20 + (long)(int)((uVar24 >> 3) * iVar18) * 4);
        uVar38 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar9 = vunpcklpd_avx(auVar62,auVar7);
          auVar62 = vunpckhpd_avx(auVar62,auVar7);
          auVar7 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar9._0_16_;
          *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar62._0_16_;
          *(undefined1 (*) [16])(pauVar26[2] + 0x10) = auVar7._0_16_;
          *(undefined1 (*) [16])(pauVar26[3] + 0x10) = auVar6._0_16_;
          *(undefined1 (*) [16])(pauVar26[4] + 0x10) = auVar9._16_16_;
          *(undefined1 (*) [16])(pauVar26[5] + 0x10) = auVar62._16_16_;
          *(undefined1 (*) [16])(pauVar26[6] + 0x10) = auVar7._16_16_;
          *(undefined1 (*) [16])(pauVar26[7] + 0x10) = auVar6._16_16_;
          pauVar35 = pauVar35 + 2;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)iVar18 * 4);
          uVar38 = 4;
        }
        iVar27 = uVar38 + 7;
        while (iVar27 < max_jj) {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar99 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[2],
                                 *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[2],
                                 *(undefined1 (*) [32])(pauVar35[2] + 0x20));
          auVar73 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[3],
                                  *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[3],
                                 *(undefined1 (*) [32])(pauVar35[3] + 0x20));
          auVar100 = vunpcklpd_avx(auVar62,auVar99);
          auVar62 = vunpckhpd_avx(auVar62,auVar99);
          auVar99 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          auVar103 = vunpcklpd_avx(auVar8,auVar73);
          auVar98 = vunpckhpd_avx(auVar8,auVar73);
          auVar8 = vunpcklpd_avx(auVar9,auVar7);
          auVar9 = vunpckhpd_avx(auVar9,auVar7);
          auVar72._16_16_ = auVar103._0_16_;
          auVar72._0_16_ = auVar100._0_16_;
          auVar102._16_16_ = auVar98._0_16_;
          auVar102._0_16_ = auVar62._0_16_;
          auVar106._16_16_ = auVar8._0_16_;
          auVar106._0_16_ = auVar99._0_16_;
          auVar108._16_16_ = auVar9._0_16_;
          auVar108._0_16_ = auVar6._0_16_;
          auVar7 = vperm2f128_avx(auVar100,auVar103,0x31);
          auVar62 = vperm2f128_avx(auVar62,auVar98,0x31);
          auVar98 = vperm2f128_avx(auVar99,auVar8,0x31);
          auVar6 = vperm2f128_avx(auVar6,auVar9,0x31);
          *pauVar26 = auVar72;
          pauVar26[1] = auVar102;
          pauVar26[2] = auVar106;
          pauVar26[3] = auVar108;
          pauVar26[4] = auVar7;
          pauVar26[5] = auVar62;
          pauVar26[6] = auVar98;
          pauVar26[7] = auVar6;
          pauVar35 = pauVar35 + 4;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar28);
          iVar27 = uVar38 + 0xf;
          uVar38 = uVar38 + 8;
        }
        uVar38 = uVar38 | 3;
        if ((int)uVar38 < max_jj) {
          pauVar26 = pauVar26 + 7;
          do {
            auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                    *(undefined1 (*) [32])(*pauVar35 + 0x20));
            auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                   *(undefined1 (*) [32])(*pauVar35 + 0x20));
            auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                   *(undefined1 (*) [32])(pauVar35[1] + 0x20));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                    *(undefined1 (*) [32])(pauVar35[1] + 0x20));
            auVar9 = vunpcklpd_avx(auVar62,auVar7);
            auVar62 = vunpckhpd_avx(auVar62,auVar7);
            auVar7 = vunpcklpd_avx(auVar6,auVar98);
            auVar6 = vunpckhpd_avx(auVar6,auVar98);
            *(undefined1 (*) [16])pauVar26[-7] = auVar9._0_16_;
            *(undefined1 (*) [16])pauVar26[-6] = auVar62._0_16_;
            *(undefined1 (*) [16])pauVar26[-5] = auVar7._0_16_;
            *(undefined1 (*) [16])pauVar26[-4] = auVar6._0_16_;
            *(undefined1 (*) [16])pauVar26[-3] = auVar9._16_16_;
            *(undefined1 (*) [16])pauVar26[-2] = auVar62._16_16_;
            *(undefined1 (*) [16])pauVar26[-1] = auVar7._16_16_;
            *(undefined1 (*) [16])*pauVar26 = auVar6._16_16_;
            pauVar35 = pauVar35 + 2;
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar28);
            uVar38 = uVar38 + 4;
          } while ((int)uVar38 < max_jj);
        }
      }
      if (3 < max_jj && iVar1 == 4) {
        pauVar26 = (undefined1 (*) [32])((long)top_blob->data + lVar20);
        iVar27 = 3;
        do {
          auVar62 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar35,
                                  *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar35,
                                 *(undefined1 (*) [32])(*pauVar35 + 0x20));
          auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar35[1],
                                 *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar98 = vunpckhps_avx(*(undefined1 (*) [32])pauVar35[1],
                                  *(undefined1 (*) [32])(pauVar35[1] + 0x20));
          auVar9 = vunpcklpd_avx(auVar62,auVar7);
          auVar62 = vunpckhpd_avx(auVar62,auVar7);
          auVar7 = vunpcklpd_avx(auVar6,auVar98);
          auVar6 = vunpckhpd_avx(auVar6,auVar98);
          auVar98._16_16_ = auVar62._0_16_;
          auVar98._0_16_ = auVar9._0_16_;
          auVar99._16_16_ = auVar6._0_16_;
          auVar99._0_16_ = auVar7._0_16_;
          auVar62 = vperm2f128_avx(auVar9,auVar62,0x31);
          auVar6 = vperm2f128_avx(auVar7,auVar6,0x31);
          pauVar26[-3] = auVar98;
          pauVar26[-2] = auVar99;
          pauVar26[-1] = auVar62;
          *pauVar26 = auVar6;
          pauVar35 = pauVar35 + 2;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar2 * 4) * 4);
          iVar27 = iVar27 + 4;
        } while (iVar27 < max_jj);
      }
      if (0 < max_jj && iVar1 == 1) {
        pauVar26 = (undefined1 (*) [32])((long)top_blob->data + lVar39);
        iVar27 = max_jj;
        do {
          *pauVar26 = *(undefined1 (*) [32])*pauVar35;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar31 * 4);
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
      }
      uVar44 = uVar23 + 8;
      lVar21 = uVar23 + 0xf;
      lVar20 = lVar20 + 0x80;
      lVar39 = lVar39 + 0x20;
      uVar23 = uVar44;
    } while (lVar21 < lVar46);
  }
  if ((int)((uint)uVar44 | 3) < max_ii) {
    iVar17 = iVar2 * 8;
    uVar33 = j + 7;
    iVar18 = j + 0xf;
    if (-1 < j) {
      uVar33 = j;
      iVar18 = j;
    }
    iVar27 = j % 0x10;
    lVar20 = (long)(iVar2 * 0x10);
    uVar23 = uVar44 & 0xffffffff;
    lVar30 = lVar20 * 4;
    lVar28 = (long)iVar17 * 4;
    lVar32 = (lVar47 + uVar23) * 0x10 + (long)(iVar2 * j) * 4 + 0x30;
    lVar39 = (long)(iVar2 * j) * 4 + lVar47 * 4 + uVar23 * 4;
    do {
      if (iVar1 == 0x10) {
        pauVar40 = (undefined1 (*) [16])
                   ((long)top_blob->data +
                   (uVar23 + lVar47) * 0x40 + (long)((iVar18 >> 4) * iVar2 * 0x10) * 4);
        iVar22 = 0;
        if (iVar27 == 4) {
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar35 + 0x30));
          if (max_jj < 5) {
            auVar54 = vunpcklpd_avx(auVar49,auVar50);
            auVar50 = vunpckhpd_avx(auVar49,auVar50);
            auVar49 = vunpcklpd_avx(auVar48,auVar4);
            auVar48 = vunpckhpd_avx(auVar48,auVar4);
            iVar22 = 4;
            local_a0 = 0x40;
            lVar34 = 0xd0;
            lVar37 = 0x90;
            lVar45 = 0x50;
            lVar21 = 0x10;
          }
          else {
            auVar51 = vunpcklpd_avx(auVar49,auVar50);
            auVar3 = vunpckhpd_avx(auVar49,auVar50);
            auVar52 = vunpcklpd_avx(auVar48,auVar4);
            auVar50 = vunpckhpd_avx(auVar48,auVar4);
            auVar4 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                   *(undefined1 (*) [16])(pauVar35[1] + 0x10));
            auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x30));
            auVar48 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x10));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x30));
            auVar53 = vunpcklpd_avx(auVar4,auVar54);
            auVar4 = vunpckhpd_avx(auVar4,auVar54);
            auVar55 = vunpcklpd_avx(auVar48,auVar49);
            auVar49 = vunpckhpd_avx(auVar48,auVar49);
            auVar54 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[2],
                                    *(undefined1 (*) [16])(pauVar35[2] + 0x10));
            auVar57 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                    *(undefined1 (*) [16])(pauVar35[2] + 0x30));
            auVar48 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[2],
                                    *(undefined1 (*) [16])(pauVar35[2] + 0x10));
            auVar5 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                   *(undefined1 (*) [16])(pauVar35[2] + 0x30));
            auVar56 = vunpcklpd_avx(auVar54,auVar57);
            auVar57 = vunpckhpd_avx(auVar54,auVar57);
            auVar54 = vunpcklpd_avx(auVar48,auVar5);
            auVar48 = vunpckhpd_avx(auVar48,auVar5);
            pauVar40[1] = auVar51;
            pauVar40[2] = auVar53;
            pauVar40[3] = auVar56;
            pauVar40[5] = auVar3;
            pauVar40[6] = auVar4;
            pauVar40[7] = auVar57;
            pauVar40[9] = auVar52;
            pauVar40[10] = auVar55;
            iVar22 = 0xc;
            local_a0 = 0xc0;
            lVar34 = 0xf0;
            lVar37 = 0xe0;
            lVar45 = 0xd0;
            lVar21 = 0xb0;
          }
          *(undefined1 (*) [16])(*pauVar40 + lVar21) = auVar54;
          *(undefined1 (*) [16])(*pauVar40 + lVar45) = auVar50;
          *(undefined1 (*) [16])(*pauVar40 + lVar37) = auVar49;
          *(undefined1 (*) [16])(*pauVar40 + lVar34) = auVar48;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + local_a0);
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20 * 4);
        }
        if (iVar27 == 8) {
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar35 + 0x30));
          if (max_jj < 5) {
            auVar54 = vunpcklpd_avx(auVar49,auVar50);
            auVar50 = vunpckhpd_avx(auVar49,auVar50);
            auVar49 = vunpcklpd_avx(auVar48,auVar4);
            auVar48 = vunpckhpd_avx(auVar48,auVar4);
            local_a0._0_4_ = 4;
            local_88 = 0x40;
            lVar37 = 0xe0;
            lVar45 = 0xa0;
            lVar21 = 0x60;
            lVar34 = 0x20;
          }
          else {
            auVar5 = vunpcklpd_avx(auVar49,auVar50);
            auVar3 = vunpckhpd_avx(auVar49,auVar50);
            auVar54 = vunpcklpd_avx(auVar48,auVar4);
            auVar49 = vunpckhpd_avx(auVar48,auVar4);
            auVar4 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                   *(undefined1 (*) [16])(pauVar35[1] + 0x10));
            auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x30));
            auVar48 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x10));
            auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar35[1] + 0x30));
            auVar51 = vunpcklpd_avx(auVar4,auVar50);
            auVar4 = vunpckhpd_avx(auVar4,auVar50);
            auVar50 = vunpcklpd_avx(auVar48,auVar57);
            auVar48 = vunpckhpd_avx(auVar48,auVar57);
            pauVar40[2] = auVar5;
            pauVar40[3] = auVar51;
            pauVar40[6] = auVar3;
            pauVar40[7] = auVar4;
            local_a0._0_4_ = 8;
            local_88 = 0x80;
            lVar37 = 0xf0;
            lVar45 = 0xe0;
            lVar21 = 0xb0;
            lVar34 = 0xa0;
          }
          *(undefined1 (*) [16])(*pauVar40 + lVar34) = auVar54;
          *(undefined1 (*) [16])(*pauVar40 + lVar21) = auVar50;
          *(undefined1 (*) [16])(*pauVar40 + lVar45) = auVar49;
          *(undefined1 (*) [16])(*pauVar40 + lVar37) = auVar48;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + local_88);
          iVar22 = iVar22 + (int)local_a0;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20 * 4);
        }
        if (iVar27 == 0xc) {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar50 = vunpcklpd_avx(auVar48,auVar54);
          auVar48 = vunpckhpd_avx(auVar48,auVar54);
          auVar54 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          pauVar40[3] = auVar50;
          pauVar40[7] = auVar48;
          pauVar40[0xb] = auVar54;
          pauVar40[0xf] = auVar4;
          pauVar35 = pauVar35 + 1;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20 * 4);
          iVar22 = iVar22 + 4;
        }
        iVar42 = iVar22 + 0xf;
        while (iVar42 < max_jj) {
          auVar49 = vunpcklps_avx512vl(*(undefined1 (*) [16])*pauVar35,
                                       *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx512vl(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                       *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar51 = vunpcklpd_avx512vl(auVar49,auVar50);
          auVar52 = vunpckhpd_avx512vl(auVar49,auVar50);
          auVar53 = vunpcklpd_avx512vl(auVar48,auVar4);
          auVar48 = vunpckhpd_avx(auVar48,auVar4);
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar54 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                       *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                 *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar55 = vunpcklpd_avx512vl(auVar50,auVar54);
          auVar56 = vunpckhpd_avx512vl(auVar50,auVar54);
          auVar3 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[2],
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x10));
          auVar57 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                       *(undefined1 (*) [16])(pauVar35[2] + 0x30));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[2],
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x10));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x30));
          auVar58 = vunpcklpd_avx512vl(auVar54,auVar57);
          auVar59 = vunpckhpd_avx512vl(auVar54,auVar57);
          auVar57 = vunpcklpd_avx(auVar49,auVar50);
          auVar49 = vunpckhpd_avx(auVar49,auVar50);
          auVar5 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[3],
                                 *(undefined1 (*) [16])(pauVar35[3] + 0x10));
          auVar60 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar35[3] + 0x20),
                                       *(undefined1 (*) [16])(pauVar35[3] + 0x30));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[3],
                                  *(undefined1 (*) [16])(pauVar35[3] + 0x10));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[3] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[3] + 0x30));
          auVar61 = vunpcklpd_avx512vl(auVar5,auVar60);
          auVar60 = vunpckhpd_avx512vl(auVar5,auVar60);
          auVar5 = vunpcklpd_avx(auVar50,auVar54);
          auVar50 = vunpckhpd_avx(auVar50,auVar54);
          *pauVar40 = auVar51;
          pauVar40[1] = auVar55;
          pauVar40[2] = auVar58;
          pauVar40[3] = auVar61;
          pauVar40[4] = auVar52;
          pauVar40[5] = auVar56;
          pauVar40[6] = auVar59;
          pauVar40[7] = auVar60;
          pauVar40[8] = auVar53;
          pauVar40[9] = auVar3;
          pauVar40[10] = auVar57;
          pauVar40[0xb] = auVar5;
          pauVar40[0xc] = auVar48;
          pauVar40[0xd] = auVar4;
          pauVar40[0xe] = auVar49;
          pauVar40[0xf] = auVar50;
          pauVar35 = pauVar35 + 4;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar30);
          iVar42 = iVar22 + 0x1f;
          iVar22 = iVar22 + 0x10;
        }
        iVar42 = iVar22 + 0xb;
        while (iVar42 < max_jj) {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar5 = vunpcklpd_avx(auVar48,auVar50);
          auVar48 = vunpckhpd_avx(auVar48,auVar50);
          auVar51 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar3 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                 *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar52 = vunpcklpd_avx(auVar49,auVar3);
          auVar49 = vunpckhpd_avx(auVar49,auVar3);
          auVar53 = vunpcklpd_avx(auVar50,auVar54);
          auVar50 = vunpckhpd_avx(auVar50,auVar54);
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[2],
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x10));
          auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x30));
          auVar3 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[2],
                                 *(undefined1 (*) [16])(pauVar35[2] + 0x10));
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[2] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[2] + 0x30));
          auVar55 = vunpcklpd_avx(auVar54,auVar56);
          auVar54 = vunpckhpd_avx(auVar54,auVar56);
          auVar56 = vunpcklpd_avx(auVar3,auVar57);
          auVar3 = vunpckhpd_avx(auVar3,auVar57);
          *pauVar40 = auVar5;
          pauVar40[1] = auVar52;
          pauVar40[2] = auVar55;
          pauVar40[4] = auVar48;
          pauVar40[5] = auVar49;
          pauVar40[6] = auVar54;
          pauVar40[8] = auVar51;
          pauVar40[9] = auVar53;
          pauVar40[10] = auVar56;
          pauVar40[0xc] = auVar4;
          pauVar40[0xd] = auVar50;
          pauVar40[0xe] = auVar3;
          pauVar35 = pauVar35 + 3;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar30);
          iVar42 = iVar22 + 0x17;
          iVar22 = iVar22 + 0xc;
        }
        iVar42 = iVar22 + 7;
        while (iVar42 < max_jj) {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar3 = vunpcklpd_avx(auVar48,auVar50);
          auVar48 = vunpckhpd_avx(auVar48,auVar50);
          auVar57 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar5 = vunpcklpd_avx(auVar49,auVar51);
          auVar49 = vunpckhpd_avx(auVar49,auVar51);
          auVar51 = vunpcklpd_avx(auVar50,auVar54);
          auVar50 = vunpckhpd_avx(auVar50,auVar54);
          *pauVar40 = auVar3;
          pauVar40[1] = auVar5;
          pauVar40[4] = auVar48;
          pauVar40[5] = auVar49;
          pauVar40[8] = auVar57;
          pauVar40[9] = auVar51;
          pauVar40[0xc] = auVar4;
          pauVar40[0xd] = auVar50;
          pauVar35 = pauVar35 + 2;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar30);
          iVar42 = iVar22 + 0xf;
          iVar22 = iVar22 + 8;
        }
        iVar22 = iVar22 + 3;
        if (iVar22 < max_jj) {
          pauVar40 = pauVar40 + 0xc;
          do {
            auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                    *(undefined1 (*) [16])(*pauVar35 + 0x10));
            auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar35 + 0x30));
            auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                   *(undefined1 (*) [16])(*pauVar35 + 0x10));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar35 + 0x30));
            auVar50 = vunpcklpd_avx(auVar48,auVar54);
            auVar48 = vunpckhpd_avx(auVar48,auVar54);
            auVar54 = vunpcklpd_avx(auVar4,auVar49);
            auVar4 = vunpckhpd_avx(auVar4,auVar49);
            pauVar40[-0xc] = auVar50;
            pauVar40[-8] = auVar48;
            pauVar40[-4] = auVar54;
            *pauVar40 = auVar4;
            pauVar35 = pauVar35 + 1;
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar30);
            iVar22 = iVar22 + 4;
          } while (iVar22 < max_jj);
        }
      }
      if (iVar1 == 8) {
        pauVar40 = (undefined1 (*) [16])
                   ((long)top_blob->data +
                   (lVar47 + uVar23) * 0x20 + (long)(int)((uVar33 >> 3) * iVar17) * 4);
        uVar24 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar50 = vunpcklpd_avx(auVar48,auVar54);
          auVar48 = vunpckhpd_avx(auVar48,auVar54);
          auVar54 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          pauVar40[1] = auVar50;
          pauVar40[3] = auVar48;
          pauVar40[5] = auVar54;
          pauVar40[7] = auVar4;
          pauVar35 = pauVar35 + 1;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + (long)iVar17 * 4);
          uVar24 = 4;
        }
        iVar22 = uVar24 + 7;
        while (iVar22 < max_jj) {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar3 = vunpcklpd_avx(auVar48,auVar50);
          auVar48 = vunpckhpd_avx(auVar48,auVar50);
          auVar57 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])pauVar35[1],
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x10));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar35[1] + 0x20),
                                  *(undefined1 (*) [16])(pauVar35[1] + 0x30));
          auVar5 = vunpcklpd_avx(auVar49,auVar51);
          auVar49 = vunpckhpd_avx(auVar49,auVar51);
          auVar51 = vunpcklpd_avx(auVar50,auVar54);
          auVar50 = vunpckhpd_avx(auVar50,auVar54);
          *pauVar40 = auVar3;
          pauVar40[1] = auVar5;
          pauVar40[2] = auVar48;
          pauVar40[3] = auVar49;
          pauVar40[4] = auVar57;
          pauVar40[5] = auVar51;
          pauVar40[6] = auVar4;
          pauVar40[7] = auVar50;
          pauVar35 = pauVar35 + 2;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar28);
          iVar22 = uVar24 + 0xf;
          uVar24 = uVar24 + 8;
        }
        uVar24 = uVar24 | 3;
        if ((int)uVar24 < max_jj) {
          pauVar40 = pauVar40 + 6;
          do {
            auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                    *(undefined1 (*) [16])(*pauVar35 + 0x10));
            auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar35 + 0x30));
            auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                   *(undefined1 (*) [16])(*pauVar35 + 0x10));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar35 + 0x30));
            auVar50 = vunpcklpd_avx(auVar48,auVar54);
            auVar48 = vunpckhpd_avx(auVar48,auVar54);
            auVar54 = vunpcklpd_avx(auVar4,auVar49);
            auVar4 = vunpckhpd_avx(auVar4,auVar49);
            pauVar40[-6] = auVar50;
            pauVar40[-4] = auVar48;
            pauVar40[-2] = auVar54;
            *pauVar40 = auVar4;
            pauVar35 = pauVar35 + 1;
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar28);
            uVar24 = uVar24 + 4;
          } while ((int)uVar24 < max_jj);
        }
      }
      if (3 < max_jj && iVar1 == 4) {
        pauVar40 = (undefined1 (*) [16])((long)top_blob->data + lVar32);
        iVar22 = 3;
        do {
          auVar48 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar35,
                                  *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar35,
                                 *(undefined1 (*) [16])(*pauVar35 + 0x10));
          auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar35 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar35 + 0x30));
          auVar50 = vunpcklpd_avx(auVar48,auVar54);
          auVar48 = vunpckhpd_avx(auVar48,auVar54);
          auVar54 = vunpcklpd_avx(auVar4,auVar49);
          auVar4 = vunpckhpd_avx(auVar4,auVar49);
          pauVar40[-3] = auVar50;
          pauVar40[-2] = auVar48;
          pauVar40[-1] = auVar54;
          *pauVar40 = auVar4;
          pauVar35 = pauVar35 + 1;
          iVar22 = iVar22 + 4;
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + (long)(iVar2 * 4) * 4);
        } while (iVar22 < max_jj);
      }
      if (0 < max_jj && iVar1 == 1) {
        pauVar40 = (undefined1 (*) [16])((long)top_blob->data + lVar39);
        iVar22 = max_jj;
        do {
          *pauVar40 = *(undefined1 (*) [16])*pauVar35;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
          pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar31 * 4);
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      uVar44 = uVar23 + 4;
      lVar21 = uVar23 + 7;
      lVar32 = lVar32 + 0x40;
      lVar39 = lVar39 + 0x10;
      uVar23 = uVar44;
    } while (lVar21 < lVar46);
  }
  if ((int)((uint)uVar44 | 1) < max_ii) {
    iVar17 = iVar2 * 8;
    iVar27 = iVar2 * 0x10;
    uVar33 = j + 7;
    iVar18 = j + 0xf;
    if (-1 < j) {
      uVar33 = j;
      iVar18 = j;
    }
    iVar22 = j % 0x10;
    uVar23 = (ulong)(int)(uint)uVar44;
    lVar30 = (uVar23 + lVar47) * 0x10 + (long)(iVar2 * j) * 4 + 0x1c;
    lVar39 = lVar47 * 4 + uVar23 * 4 + (long)(iVar2 * j) * 4 + 4;
    do {
      if (iVar1 == 0x10) {
        puVar41 = (undefined4 *)
                  ((long)top_blob->data +
                  (uVar23 + lVar47) * 0x40 + (long)((iVar18 >> 4) * iVar27) * 4);
        iVar42 = 0;
        if (iVar22 == 4) {
          puVar41[4] = *(undefined4 *)*pauVar35;
          puVar41[5] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x18);
          if (max_jj < 5) {
            iVar42 = 4;
            local_a0 = 0x20;
            local_88 = 0x5c;
            local_80 = 0x1c;
            local_50 = 0x58;
            local_58 = 0x14;
            lVar28 = 0x54;
            lVar20 = 0xc;
            lVar32 = 0x50;
            lVar21 = 4;
          }
          else {
            puVar41[8] = *(undefined4 *)(*pauVar35 + 0x20);
            puVar41[9] = *(undefined4 *)(*pauVar35 + 0x28);
            puVar41[10] = *(undefined4 *)(*pauVar35 + 0x30);
            puVar41[0xb] = *(undefined4 *)(*pauVar35 + 0x38);
            puVar41[0xc] = *(undefined4 *)pauVar35[1];
            puVar41[0xd] = *(undefined4 *)(pauVar35[1] + 8);
            puVar41[0xe] = *(undefined4 *)(pauVar35[1] + 0x10);
            puVar41[0xf] = *(undefined4 *)(pauVar35[1] + 0x18);
            puVar41[0x14] = *(undefined4 *)(*pauVar35 + 4);
            puVar41[0x15] = *(undefined4 *)(*pauVar35 + 0xc);
            puVar41[0x16] = *(undefined4 *)(*pauVar35 + 0x14);
            puVar41[0x17] = *(undefined4 *)(*pauVar35 + 0x1c);
            puVar41[0x18] = *(undefined4 *)(*pauVar35 + 0x24);
            puVar41[0x19] = *(undefined4 *)(*pauVar35 + 0x2c);
            puVar41[0x1a] = *(undefined4 *)(*pauVar35 + 0x34);
            puVar41[0x1b] = *(undefined4 *)(*pauVar35 + 0x3c);
            iVar42 = 0xc;
            local_a0 = 0x60;
            local_88 = 0x7c;
            local_80 = 0x5c;
            local_50 = 0x78;
            local_58 = 0x54;
            lVar28 = 0x74;
            lVar20 = 0x4c;
            lVar32 = 0x70;
            lVar21 = 0x44;
          }
          *(undefined4 *)((long)puVar41 + lVar32) = *(undefined4 *)(*pauVar35 + lVar21);
          *(undefined4 *)((long)puVar41 + lVar28) = *(undefined4 *)(*pauVar35 + lVar20);
          *(undefined4 *)((long)puVar41 + local_50) = *(undefined4 *)(*pauVar35 + local_58);
          *(undefined4 *)((long)puVar41 + local_88) = *(undefined4 *)(*pauVar35 + local_80);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + local_a0);
          puVar41 = puVar41 + iVar27;
        }
        if (iVar22 == 8) {
          puVar41[8] = *(undefined4 *)*pauVar35;
          puVar41[9] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[10] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[0xb] = *(undefined4 *)(*pauVar35 + 0x18);
          if (max_jj < 5) {
            local_a0._0_4_ = 4;
            local_88 = 0x20;
            local_80 = 0x6c;
            local_50 = 0x1c;
            local_58 = 0x68;
            local_40 = 0x14;
            lVar20 = 100;
            lVar32 = 0xc;
            lVar21 = 0x60;
            lVar28 = 4;
          }
          else {
            puVar41[0xc] = *(undefined4 *)(*pauVar35 + 0x20);
            puVar41[0xd] = *(undefined4 *)(*pauVar35 + 0x28);
            puVar41[0xe] = *(undefined4 *)(*pauVar35 + 0x30);
            puVar41[0xf] = *(undefined4 *)(*pauVar35 + 0x38);
            puVar41[0x18] = *(undefined4 *)(*pauVar35 + 4);
            puVar41[0x19] = *(undefined4 *)(*pauVar35 + 0xc);
            puVar41[0x1a] = *(undefined4 *)(*pauVar35 + 0x14);
            puVar41[0x1b] = *(undefined4 *)(*pauVar35 + 0x1c);
            local_a0._0_4_ = 8;
            local_88 = 0x40;
            local_80 = 0x7c;
            local_50 = 0x3c;
            local_58 = 0x78;
            local_40 = 0x34;
            lVar20 = 0x74;
            lVar32 = 0x2c;
            lVar21 = 0x70;
            lVar28 = 0x24;
          }
          *(undefined4 *)((long)puVar41 + lVar21) = *(undefined4 *)(*pauVar35 + lVar28);
          *(undefined4 *)((long)puVar41 + lVar20) = *(undefined4 *)(*pauVar35 + lVar32);
          *(undefined4 *)((long)puVar41 + local_58) = *(undefined4 *)(*pauVar35 + local_40);
          *(undefined4 *)((long)puVar41 + local_80) = *(undefined4 *)(*pauVar35 + local_50);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + local_88);
          iVar42 = iVar42 + (int)local_a0;
          puVar41 = puVar41 + iVar27;
        }
        if (iVar22 == 0xc) {
          puVar41[0xc] = *(undefined4 *)*pauVar35;
          puVar41[0xd] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[0xe] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[0xf] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[0x1c] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[0x1d] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[0x1e] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0x1f] = *(undefined4 *)(*pauVar35 + 0x1c);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          puVar41 = puVar41 + iVar27;
          iVar42 = iVar42 + 4;
        }
        iVar43 = iVar42 + 0xf;
        while (iVar43 < max_jj) {
          *puVar41 = *(undefined4 *)*pauVar35;
          puVar41[1] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[2] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[3] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[4] = *(undefined4 *)(*pauVar35 + 0x20);
          puVar41[5] = *(undefined4 *)(*pauVar35 + 0x28);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x30);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x38);
          puVar41[8] = *(undefined4 *)pauVar35[1];
          puVar41[9] = *(undefined4 *)(pauVar35[1] + 8);
          puVar41[10] = *(undefined4 *)(pauVar35[1] + 0x10);
          puVar41[0xb] = *(undefined4 *)(pauVar35[1] + 0x18);
          puVar41[0xc] = *(undefined4 *)(pauVar35[1] + 0x20);
          puVar41[0xd] = *(undefined4 *)(pauVar35[1] + 0x28);
          puVar41[0xe] = *(undefined4 *)(pauVar35[1] + 0x30);
          puVar41[0xf] = *(undefined4 *)(pauVar35[1] + 0x38);
          puVar41[0x10] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[0x11] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[0x12] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0x13] = *(undefined4 *)(*pauVar35 + 0x1c);
          puVar41[0x14] = *(undefined4 *)(*pauVar35 + 0x24);
          puVar41[0x15] = *(undefined4 *)(*pauVar35 + 0x2c);
          puVar41[0x16] = *(undefined4 *)(*pauVar35 + 0x34);
          puVar41[0x17] = *(undefined4 *)(*pauVar35 + 0x3c);
          puVar41[0x18] = *(undefined4 *)(pauVar35[1] + 4);
          puVar41[0x19] = *(undefined4 *)(pauVar35[1] + 0xc);
          puVar41[0x1a] = *(undefined4 *)(pauVar35[1] + 0x14);
          puVar41[0x1b] = *(undefined4 *)(pauVar35[1] + 0x1c);
          puVar41[0x1c] = *(undefined4 *)(pauVar35[1] + 0x24);
          puVar41[0x1d] = *(undefined4 *)(pauVar35[1] + 0x2c);
          puVar41[0x1e] = *(undefined4 *)(pauVar35[1] + 0x34);
          puVar41[0x1f] = *(undefined4 *)(pauVar35[1] + 0x3c);
          pauVar35 = pauVar35 + 2;
          puVar41 = puVar41 + iVar27;
          iVar43 = iVar42 + 0x1f;
          iVar42 = iVar42 + 0x10;
        }
        iVar43 = iVar42 + 0xb;
        while (iVar43 < max_jj) {
          *puVar41 = *(undefined4 *)*pauVar35;
          puVar41[1] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[2] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[3] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[4] = *(undefined4 *)(*pauVar35 + 0x20);
          puVar41[5] = *(undefined4 *)(*pauVar35 + 0x28);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x30);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x38);
          puVar41[8] = *(undefined4 *)pauVar35[1];
          puVar41[9] = *(undefined4 *)(pauVar35[1] + 8);
          puVar41[10] = *(undefined4 *)(pauVar35[1] + 0x10);
          puVar41[0xb] = *(undefined4 *)(pauVar35[1] + 0x18);
          puVar41[0x10] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[0x11] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[0x12] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0x13] = *(undefined4 *)(*pauVar35 + 0x1c);
          puVar41[0x14] = *(undefined4 *)(*pauVar35 + 0x24);
          puVar41[0x15] = *(undefined4 *)(*pauVar35 + 0x2c);
          puVar41[0x16] = *(undefined4 *)(*pauVar35 + 0x34);
          puVar41[0x17] = *(undefined4 *)(*pauVar35 + 0x3c);
          puVar41[0x18] = *(undefined4 *)(pauVar35[1] + 4);
          puVar41[0x19] = *(undefined4 *)(pauVar35[1] + 0xc);
          puVar41[0x1a] = *(undefined4 *)(pauVar35[1] + 0x14);
          puVar41[0x1b] = *(undefined4 *)(pauVar35[1] + 0x1c);
          pauVar35 = (undefined1 (*) [64])(pauVar35[1] + 0x20);
          puVar41 = puVar41 + iVar27;
          iVar43 = iVar42 + 0x17;
          iVar42 = iVar42 + 0xc;
        }
        iVar43 = iVar42 + 7;
        while (iVar43 < max_jj) {
          *puVar41 = *(undefined4 *)*pauVar35;
          puVar41[1] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[2] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[3] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[4] = *(undefined4 *)(*pauVar35 + 0x20);
          puVar41[5] = *(undefined4 *)(*pauVar35 + 0x28);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x30);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x38);
          puVar41[0x10] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[0x11] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[0x12] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0x13] = *(undefined4 *)(*pauVar35 + 0x1c);
          puVar41[0x14] = *(undefined4 *)(*pauVar35 + 0x24);
          puVar41[0x15] = *(undefined4 *)(*pauVar35 + 0x2c);
          puVar41[0x16] = *(undefined4 *)(*pauVar35 + 0x34);
          puVar41[0x17] = *(undefined4 *)(*pauVar35 + 0x3c);
          pauVar35 = pauVar35 + 1;
          puVar41 = puVar41 + iVar27;
          iVar43 = iVar42 + 0xf;
          iVar42 = iVar42 + 8;
        }
        iVar42 = iVar42 + 3;
        if (iVar42 < max_jj) {
          puVar41 = puVar41 + 0x13;
          do {
            puVar41[-0x13] = *(undefined4 *)*pauVar35;
            puVar41[-0x12] = *(undefined4 *)(*pauVar35 + 8);
            puVar41[-0x11] = *(undefined4 *)(*pauVar35 + 0x10);
            puVar41[-0x10] = *(undefined4 *)(*pauVar35 + 0x18);
            puVar41[-3] = *(undefined4 *)(*pauVar35 + 4);
            puVar41[-2] = *(undefined4 *)(*pauVar35 + 0xc);
            puVar41[-1] = *(undefined4 *)(*pauVar35 + 0x14);
            *puVar41 = *(undefined4 *)(*pauVar35 + 0x1c);
            pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
            iVar42 = iVar42 + 4;
            puVar41 = puVar41 + iVar27;
          } while (iVar42 < max_jj);
        }
      }
      if (iVar1 == 8) {
        puVar41 = (undefined4 *)
                  ((long)top_blob->data +
                  (lVar47 + uVar23) * 0x20 + (long)(int)((uVar33 >> 3) * iVar17) * 4);
        uVar24 = 0;
        if ((j & 0x80000007U) == 4) {
          puVar41[4] = *(undefined4 *)*pauVar35;
          puVar41[5] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[0xc] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[0xd] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[0xe] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0xf] = *(undefined4 *)(*pauVar35 + 0x1c);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          puVar41 = puVar41 + iVar17;
          uVar24 = 4;
        }
        iVar42 = uVar24 + 7;
        while (iVar42 < max_jj) {
          *puVar41 = *(undefined4 *)*pauVar35;
          puVar41[1] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[2] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[3] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[4] = *(undefined4 *)(*pauVar35 + 0x20);
          puVar41[5] = *(undefined4 *)(*pauVar35 + 0x28);
          puVar41[6] = *(undefined4 *)(*pauVar35 + 0x30);
          puVar41[7] = *(undefined4 *)(*pauVar35 + 0x38);
          puVar41[8] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[9] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[10] = *(undefined4 *)(*pauVar35 + 0x14);
          puVar41[0xb] = *(undefined4 *)(*pauVar35 + 0x1c);
          puVar41[0xc] = *(undefined4 *)(*pauVar35 + 0x24);
          puVar41[0xd] = *(undefined4 *)(*pauVar35 + 0x2c);
          puVar41[0xe] = *(undefined4 *)(*pauVar35 + 0x34);
          puVar41[0xf] = *(undefined4 *)(*pauVar35 + 0x3c);
          pauVar35 = pauVar35 + 1;
          puVar41 = puVar41 + iVar17;
          iVar42 = uVar24 + 0xf;
          uVar24 = uVar24 + 8;
        }
        uVar24 = uVar24 | 3;
        if ((int)uVar24 < max_jj) {
          puVar41 = puVar41 + 0xb;
          do {
            puVar41[-0xb] = *(undefined4 *)*pauVar35;
            puVar41[-10] = *(undefined4 *)(*pauVar35 + 8);
            puVar41[-9] = *(undefined4 *)(*pauVar35 + 0x10);
            puVar41[-8] = *(undefined4 *)(*pauVar35 + 0x18);
            puVar41[-3] = *(undefined4 *)(*pauVar35 + 4);
            puVar41[-2] = *(undefined4 *)(*pauVar35 + 0xc);
            puVar41[-1] = *(undefined4 *)(*pauVar35 + 0x14);
            *puVar41 = *(undefined4 *)(*pauVar35 + 0x1c);
            pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
            uVar24 = uVar24 + 4;
            puVar41 = puVar41 + iVar17;
          } while ((int)uVar24 < max_jj);
        }
      }
      if (3 < max_jj && iVar1 == 4) {
        puVar41 = (undefined4 *)((long)top_blob->data + lVar30);
        iVar42 = 3;
        do {
          puVar41[-7] = *(undefined4 *)*pauVar35;
          puVar41[-6] = *(undefined4 *)(*pauVar35 + 8);
          puVar41[-5] = *(undefined4 *)(*pauVar35 + 0x10);
          puVar41[-4] = *(undefined4 *)(*pauVar35 + 0x18);
          puVar41[-3] = *(undefined4 *)(*pauVar35 + 4);
          puVar41[-2] = *(undefined4 *)(*pauVar35 + 0xc);
          puVar41[-1] = *(undefined4 *)(*pauVar35 + 0x14);
          *puVar41 = *(undefined4 *)(*pauVar35 + 0x1c);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          iVar42 = iVar42 + 4;
          puVar41 = puVar41 + iVar2 * 4;
        } while (iVar42 < max_jj);
      }
      if (0 < max_jj && iVar1 == 1) {
        puVar41 = (undefined4 *)((long)top_blob->data + lVar39);
        iVar42 = max_jj;
        do {
          puVar41[-1] = *(undefined4 *)*pauVar35;
          *puVar41 = *(undefined4 *)(*pauVar35 + 4);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 8);
          puVar41 = puVar41 + lVar31;
          iVar42 = iVar42 + -1;
        } while (iVar42 != 0);
      }
      uVar44 = uVar23 + 2;
      lVar28 = uVar23 + 3;
      lVar30 = lVar30 + 0x20;
      lVar39 = lVar39 + 8;
      uVar23 = uVar44;
    } while (lVar28 < lVar46);
  }
  if ((int)uVar44 < max_ii) {
    uVar33 = j + 0xf;
    if (-1 < j) {
      uVar33 = j;
    }
    uVar24 = j + 7;
    if (-1 < j) {
      uVar24 = j;
    }
    iVar18 = j - (uVar33 & 0xfffffff0);
    lVar20 = (long)(iVar2 * 0x10);
    lVar32 = (long)(iVar2 * 8);
    lVar21 = (long)(int)uVar44;
    lVar28 = lVar20 * 4;
    lVar39 = (lVar21 + lVar47) * 0x10 + (long)(iVar2 * j) * 4;
    lVar30 = lVar47 * 4 + lVar21 * 4 + (long)(iVar2 * j) * 4;
    do {
      if (iVar1 == 0x10) {
        puVar36 = (undefined8 *)
                  ((long)top_blob->data +
                  (lVar47 + lVar21) * 0x40 + (long)(((int)uVar33 >> 4) * iVar2 * 0x10) * 4);
        iVar17 = 0;
        if (iVar18 == 4) {
          if (max_jj < 5) {
            uVar10 = *(undefined8 *)(*pauVar35 + 8);
            puVar36[2] = *(undefined8 *)*pauVar35;
            puVar36[3] = uVar10;
            iVar17 = 4;
            lVar34 = 0x10;
          }
          else {
            uVar12 = *(undefined8 *)(*pauVar35 + 8);
            uVar13 = *(undefined8 *)(*pauVar35 + 0x10);
            uVar14 = *(undefined8 *)(*pauVar35 + 0x18);
            uVar10 = *(undefined8 *)(*pauVar35 + 0x20);
            uVar11 = *(undefined8 *)(*pauVar35 + 0x28);
            puVar36[2] = *(undefined8 *)*pauVar35;
            puVar36[3] = uVar12;
            puVar36[4] = uVar13;
            puVar36[5] = uVar14;
            puVar36[6] = uVar10;
            puVar36[7] = uVar11;
            iVar17 = 0xc;
            lVar34 = 0x30;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar34);
          puVar36 = (undefined8 *)((long)puVar36 + lVar20 * 4);
        }
        if (iVar18 == 8) {
          if (max_jj < 5) {
            uVar10 = *(undefined8 *)(*pauVar35 + 8);
            puVar36[4] = *(undefined8 *)*pauVar35;
            puVar36[5] = uVar10;
            iVar27 = 4;
            lVar34 = 0x10;
          }
          else {
            uVar10 = *(undefined8 *)(*pauVar35 + 8);
            uVar11 = *(undefined8 *)(*pauVar35 + 0x10);
            uVar12 = *(undefined8 *)(*pauVar35 + 0x18);
            puVar36[4] = *(undefined8 *)*pauVar35;
            puVar36[5] = uVar10;
            puVar36[6] = uVar11;
            puVar36[7] = uVar12;
            iVar27 = 8;
            lVar34 = 0x20;
          }
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + lVar34);
          iVar17 = iVar17 + iVar27;
          puVar36 = (undefined8 *)((long)puVar36 + lVar20 * 4);
        }
        if (iVar18 == 0xc) {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          puVar36[6] = *(undefined8 *)*pauVar35;
          puVar36[7] = uVar10;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
          puVar36 = (undefined8 *)((long)puVar36 + lVar20 * 4);
          iVar17 = iVar17 + 4;
        }
        iVar27 = iVar17 + 0xf;
        while (iVar27 < max_jj) {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          uVar11 = *(undefined8 *)(*pauVar35 + 0x10);
          uVar12 = *(undefined8 *)(*pauVar35 + 0x18);
          uVar13 = *(undefined8 *)(*pauVar35 + 0x20);
          uVar14 = *(undefined8 *)(*pauVar35 + 0x28);
          uVar15 = *(undefined8 *)(*pauVar35 + 0x30);
          uVar16 = *(undefined8 *)(*pauVar35 + 0x38);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar10;
          puVar36[2] = uVar11;
          puVar36[3] = uVar12;
          puVar36[4] = uVar13;
          puVar36[5] = uVar14;
          puVar36[6] = uVar15;
          puVar36[7] = uVar16;
          pauVar35 = pauVar35 + 1;
          puVar36 = (undefined8 *)((long)puVar36 + lVar28);
          iVar27 = iVar17 + 0x1f;
          iVar17 = iVar17 + 0x10;
        }
        iVar27 = iVar17 + 0xb;
        while (iVar27 < max_jj) {
          uVar12 = *(undefined8 *)(*pauVar35 + 8);
          uVar13 = *(undefined8 *)(*pauVar35 + 0x10);
          uVar14 = *(undefined8 *)(*pauVar35 + 0x18);
          uVar10 = *(undefined8 *)(*pauVar35 + 0x20);
          uVar11 = *(undefined8 *)(*pauVar35 + 0x28);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar12;
          puVar36[2] = uVar13;
          puVar36[3] = uVar14;
          puVar36[4] = uVar10;
          puVar36[5] = uVar11;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x30);
          puVar36 = (undefined8 *)((long)puVar36 + lVar28);
          iVar27 = iVar17 + 0x17;
          iVar17 = iVar17 + 0xc;
        }
        iVar27 = iVar17 + 7;
        while (iVar27 < max_jj) {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          uVar11 = *(undefined8 *)(*pauVar35 + 0x10);
          uVar12 = *(undefined8 *)(*pauVar35 + 0x18);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar10;
          puVar36[2] = uVar11;
          puVar36[3] = uVar12;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          puVar36 = (undefined8 *)((long)puVar36 + lVar28);
          iVar27 = iVar17 + 0xf;
          iVar17 = iVar17 + 8;
        }
        for (iVar17 = iVar17 + 3; iVar17 < max_jj; iVar17 = iVar17 + 4) {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar10;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
          puVar36 = (undefined8 *)((long)puVar36 + lVar28);
        }
      }
      if (iVar1 == 8) {
        puVar36 = (undefined8 *)
                  ((long)top_blob->data +
                  (lVar21 + lVar47) * 0x20 + (long)(int)((uVar24 >> 3) * iVar2 * 8) * 4);
        uVar38 = 0;
        if ((j & 0x80000007U) == 4) {
          *(undefined4 *)(puVar36 + 2) = *(undefined4 *)*pauVar35;
          *(undefined4 *)((long)puVar36 + 0x14) = *(undefined4 *)(*pauVar35 + 4);
          *(undefined4 *)(puVar36 + 3) = *(undefined4 *)(*pauVar35 + 8);
          *(undefined4 *)((long)puVar36 + 0x1c) = *(undefined4 *)(*pauVar35 + 0xc);
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
          puVar36 = (undefined8 *)((long)puVar36 + lVar32 * 4);
          uVar38 = 4;
        }
        iVar17 = uVar38 + 7;
        while (iVar17 < max_jj) {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          uVar11 = *(undefined8 *)(*pauVar35 + 0x10);
          uVar12 = *(undefined8 *)(*pauVar35 + 0x18);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar10;
          puVar36[2] = uVar11;
          puVar36[3] = uVar12;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
          puVar36 = (undefined8 *)((long)puVar36 + lVar32 * 4);
          iVar17 = uVar38 + 0xf;
          uVar38 = uVar38 + 8;
        }
        uVar38 = uVar38 | 3;
        if ((int)uVar38 < max_jj) {
          puVar41 = (undefined4 *)((long)puVar36 + 0xc);
          do {
            puVar41[-3] = *(undefined4 *)*pauVar35;
            puVar41[-2] = *(undefined4 *)(*pauVar35 + 4);
            puVar41[-1] = *(undefined4 *)(*pauVar35 + 8);
            *puVar41 = *(undefined4 *)(*pauVar35 + 0xc);
            pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
            uVar38 = uVar38 + 4;
            puVar41 = puVar41 + lVar32;
          } while ((int)uVar38 < max_jj);
        }
      }
      if (3 < max_jj && iVar1 == 4) {
        puVar36 = (undefined8 *)((long)top_blob->data + lVar39);
        iVar17 = 3;
        do {
          uVar10 = *(undefined8 *)(*pauVar35 + 8);
          *puVar36 = *(undefined8 *)*pauVar35;
          puVar36[1] = uVar10;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
          iVar17 = iVar17 + 4;
          puVar36 = (undefined8 *)((long)puVar36 + (long)(iVar2 * 4) * 4);
        } while (iVar17 < max_jj);
      }
      if (0 < max_jj && iVar1 == 1) {
        puVar41 = (undefined4 *)((long)top_blob->data + lVar30);
        iVar17 = max_jj;
        do {
          *puVar41 = *(undefined4 *)*pauVar35;
          pauVar35 = (undefined1 (*) [64])(*pauVar35 + 4);
          puVar41 = puVar41 + lVar31;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      lVar21 = lVar21 + 1;
      lVar39 = lVar39 + 0x10;
      lVar30 = lVar30 + 4;
    } while (lVar21 != lVar46);
  }
  return;
}

Assistant:

static void transpose_unpack_output_tile(const Mat& topT, Mat& top_blob, int i, int max_ii, int j, int max_jj)
{
    const int out_elempack = top_blob.elempack;
    const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

    const float* pp = topT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                    __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                    __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                    __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                    transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _mm512_extractf32x8_ps(_r0, 0));
                    _mm_store_ps(p0 + 4 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm256_store_ps(p0 + 16 + 4 + 4, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _mm512_extractf32x8_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 4 + 4, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _mm512_extractf32x8_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 4 + 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    _mm256_store_ps(p0 + 16 * 5 + 4 + 4, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _mm512_extractf32x8_ps(_r4, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4 + 8, _mm512_extractf32x4_ps(_r5, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 4 + 4, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_storeu_ps(p0 + 16 * 8 + 4, _mm512_extractf32x8_ps(_r6, 0));
                    _mm_store_ps(p0 + 16 * 8 + 4 + 8, _mm512_extractf32x4_ps(_r6, 2));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r6, 3));
                    _mm256_store_ps(p0 + 16 * 9 + 4 + 4, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_storeu_ps(p0 + 16 * 10 + 4, _mm512_extractf32x8_ps(_r7, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4 + 8, _mm512_extractf32x4_ps(_r8, 0));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r8, 1));
                    _mm256_store_ps(p0 + 16 * 11 + 4 + 4, _mm512_extractf32x8_ps(_r8, 1));
                    _mm256_storeu_ps(p0 + 16 * 12 + 4, _mm512_extractf32x8_ps(_r9, 0));
                    _mm_store_ps(p0 + 16 * 12 + 4 + 8, _mm512_extractf32x4_ps(_r9, 2));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r9, 3));
                    _mm256_store_ps(p0 + 16 * 13 + 4 + 4, _mm512_extractf32x8_ps(_ra, 0));
                    _mm256_storeu_ps(p0 + 16 * 14 + 4, _mm512_extractf32x8_ps(_ra, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4 + 8, _mm512_extractf32x4_ps(_rb, 0));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_rb, 1));
                    _mm256_store_ps(p0 + 16 * 15 + 4 + 4, _mm512_extractf32x8_ps(_rb, 1));
                    pp += 192;
                    jj += 12;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _mm512_extractf32x8_ps(_r0, 0));
                    _mm256_store_ps(p0 + 16 + 8, _mm512_extractf32x8_ps(_r0, 1));
                    _mm256_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x8_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x8_ps(_r2, 0));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x8_ps(_r3, 0));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x8_ps(_r3, 1));
                    _mm256_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x8_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x8_ps(_r5, 0));
                    _mm256_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x8_ps(_r6, 0));
                    _mm256_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x8_ps(_r6, 1));
                    _mm256_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x8_ps(_r7, 1));
                    pp += 128;
                    jj += 8;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8 + 12, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9 + 12, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10 + 12, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11 + 12, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12 + 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13 + 12, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14 + 12, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15 + 12, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                __m512 _rc = _mm512_load_ps(pp + 16 * 12);
                __m512 _rd = _mm512_load_ps(pp + 16 * 13);
                __m512 _re = _mm512_load_ps(pp + 16 * 14);
                __m512 _rf = _mm512_load_ps(pp + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(p0, _r0);
                _mm512_store_ps(p0 + 16, _r1);
                _mm512_store_ps(p0 + 16 * 2, _r2);
                _mm512_store_ps(p0 + 16 * 3, _r3);
                _mm512_store_ps(p0 + 16 * 4, _r4);
                _mm512_store_ps(p0 + 16 * 5, _r5);
                _mm512_store_ps(p0 + 16 * 6, _r6);
                _mm512_store_ps(p0 + 16 * 7, _r7);
                _mm512_store_ps(p0 + 16 * 8, _r8);
                _mm512_store_ps(p0 + 16 * 9, _r9);
                _mm512_store_ps(p0 + 16 * 10, _ra);
                _mm512_store_ps(p0 + 16 * 11, _rb);
                _mm512_store_ps(p0 + 16 * 12, _rc);
                _mm512_store_ps(p0 + 16 * 13, _rd);
                _mm512_store_ps(p0 + 16 * 14, _re);
                _mm512_store_ps(p0 + 16 * 15, _rf);
                pp += 256;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 3));
                _mm256_storeu_ps(p0 + 16 + 4, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r2, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r3, 3));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r4, 1));
                _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r5, 0));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r5, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r6, 0));
                _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r6, 2));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r6, 3));
                _mm256_storeu_ps(p0 + 16 * 9 + 4, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r7, 1));
                _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r8, 0));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r8, 1));
                _mm256_storeu_ps(p0 + 16 * 11 + 4, _mm512_extractf32x8_ps(_r8, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r9, 0));
                _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r9, 2));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r9, 3));
                _mm256_storeu_ps(p0 + 16 * 13 + 4, _mm512_extractf32x8_ps(_ra, 0));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_ra, 1));
                _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_rb, 0));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_rb, 1));
                _mm256_storeu_ps(p0 + 16 * 15 + 4, _mm512_extractf32x8_ps(_rb, 1));
                pp += 192;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm256_store_ps(p0 + 16, _mm512_extractf32x8_ps(_r0, 1));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 3, _mm512_extractf32x8_ps(_r1, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r2, 0));
                _mm256_store_ps(p0 + 16 * 5, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r3, 0));
                _mm256_store_ps(p0 + 16 * 7, _mm512_extractf32x8_ps(_r3, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 9, _mm512_extractf32x8_ps(_r4, 1));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r5, 0));
                _mm256_store_ps(p0 + 16 * 11, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r6, 0));
                _mm256_store_ps(p0 + 16 * 13, _mm512_extractf32x8_ps(_r6, 1));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 15, _mm512_extractf32x8_ps(_r7, 1));
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
            }
        }
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                _mm512_storeu_ps(p0 + 16 * 4, _r4);
                _mm512_storeu_ps(p0 + 16 * 5, _r5);
                _mm512_storeu_ps(p0 + 16 * 6, _r6);
                _mm512_storeu_ps(p0 + 16 * 7, _r7);
                pp += 128;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                pp += 64;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                _mm512_storeu_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                    __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                    __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                    __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                    transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 + 8, _r2);
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r4, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r5);
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r7, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r7, 1));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r8);
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _r9);
                    _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_ra, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_ra, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _rb);
                    pp += 96;
                    jj += 12;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _r0);
                    _mm256_store_ps(p0 + 16 + 8, _r1);
                    _mm256_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm256_store_ps(p0 + 16 * 4 + 8, _r4);
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r5);
                    _mm256_store_ps(p0 + 16 * 6 + 8, _r6);
                    _mm256_store_ps(p0 + 16 * 7 + 8, _r7);
                    pp += 64;
                    jj += 8;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                __m256 _rc = _mm256_load_ps(pp + 8 * 12);
                __m256 _rd = _mm256_load_ps(pp + 8 * 13);
                __m256 _re = _mm256_load_ps(pp + 8 * 14);
                __m256 _rf = _mm256_load_ps(pp + 8 * 15);
                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 8, _r1);
                _mm256_store_ps(p0 + 8 * 2, _r2);
                _mm256_store_ps(p0 + 8 * 3, _r3);
                _mm256_store_ps(p0 + 8 * 4, _r4);
                _mm256_store_ps(p0 + 8 * 5, _r5);
                _mm256_store_ps(p0 + 8 * 6, _r6);
                _mm256_store_ps(p0 + 8 * 7, _r7);
                _mm256_store_ps(p0 + 8 * 8, _r8);
                _mm256_store_ps(p0 + 8 * 9, _r9);
                _mm256_store_ps(p0 + 8 * 10, _ra);
                _mm256_store_ps(p0 + 8 * 11, _rb);
                _mm256_store_ps(p0 + 8 * 12, _rc);
                _mm256_store_ps(p0 + 8 * 13, _rd);
                _mm256_store_ps(p0 + 8 * 14, _re);
                _mm256_store_ps(p0 + 8 * 15, _rf);
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r1, 1));
                _mm256_storeu_ps(p0 + 16 + 4, _r2);
                _mm256_store_ps(p0 + 16 * 2, _r3);
                _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r4, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r4, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _r5);
                _mm256_store_ps(p0 + 16 * 4, _r6);
                _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r7, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r7, 1));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _r8);
                _mm256_store_ps(p0 + 16 * 6, _r9);
                _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_ra, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_ra, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _rb);
                pp += 96;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 16, _r1);
                _mm256_store_ps(p0 + 16 * 2, _r2);
                _mm256_store_ps(p0 + 16 * 3, _r3);
                _mm256_store_ps(p0 + 16 * 4, _r4);
                _mm256_store_ps(p0 + 16 * 5, _r5);
                _mm256_store_ps(p0 + 16 * 6, _r6);
                _mm256_store_ps(p0 + 16 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                _mm256_storeu_ps(p0 + 8 * 4, _r4);
                _mm256_storeu_ps(p0 + 8 * 5, _r5);
                _mm256_storeu_ps(p0 + 8 * 6, _r6);
                _mm256_storeu_ps(p0 + 8 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                pp += 32;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                _mm256_storeu_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                    __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                    __m128 _ra = _mm_load_ps(pp + 4 * 10);
                    __m128 _rb = _mm_load_ps(pp + 4 * 11);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 4, _r4);
                    _mm_store_ps(p0 + 4 + 8, _r8);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 + 4 + 4, _r5);
                    _mm_store_ps(p0 + 16 + 4 + 8, _r9);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _ra);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 4, _r7);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 8, _rb);
                    pp += 48;
                    jj += 12;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 8 + 4, _r4);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 + 8 + 4, _r5);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 8 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 8 + 4, _r7);
                    pp += 32;
                    jj += 8;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _r0);
                _mm_store_ps(p0 + 16 + 12, _r1);
                _mm_store_ps(p0 + 16 * 2 + 12, _r2);
                _mm_store_ps(p0 + 16 * 3 + 12, _r3);
                pp += 16;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                __m128 _rc = _mm_load_ps(pp + 4 * 12);
                __m128 _rd = _mm_load_ps(pp + 4 * 13);
                __m128 _re = _mm_load_ps(pp + 4 * 14);
                __m128 _rf = _mm_load_ps(pp + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 4 * 2, _r8);
                _mm_store_ps(p0 + 4 * 3, _rc);
                _mm_store_ps(p0 + 4 * 4, _r1);
                _mm_store_ps(p0 + 4 * 5, _r5);
                _mm_store_ps(p0 + 4 * 6, _r9);
                _mm_store_ps(p0 + 4 * 7, _rd);
                _mm_store_ps(p0 + 4 * 8, _r2);
                _mm_store_ps(p0 + 4 * 9, _r6);
                _mm_store_ps(p0 + 4 * 10, _ra);
                _mm_store_ps(p0 + 4 * 11, _re);
                _mm_store_ps(p0 + 4 * 12, _r3);
                _mm_store_ps(p0 + 4 * 13, _r7);
                _mm_store_ps(p0 + 4 * 14, _rb);
                _mm_store_ps(p0 + 4 * 15, _rf);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 8, _r8);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 + 8, _r9);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 2 + 8, _ra);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                _mm_store_ps(p0 + 16 * 3 + 8, _rb);
                pp += 48;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _r0);
                _mm_store_ps(p0 + 8 + 4, _r1);
                _mm_store_ps(p0 + 8 * 2 + 4, _r2);
                _mm_store_ps(p0 + 8 * 3 + 4, _r3);
                pp += 16;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r4);
                _mm_storeu_ps(p0 + 4 * 2, _r1);
                _mm_storeu_ps(p0 + 4 * 3, _r5);
                _mm_storeu_ps(p0 + 4 * 4, _r2);
                _mm_storeu_ps(p0 + 4 * 5, _r6);
                _mm_storeu_ps(p0 + 4 * 6, _r3);
                _mm_storeu_ps(p0 + 4 * 7, _r7);
                pp += 32;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                _mm_store_ps(p0 + 8 * 2, _r2);
                _mm_store_ps(p0 + 8 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r1);
                _mm_storeu_ps(p0 + 4 * 2, _r2);
                _mm_storeu_ps(p0 + 4 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m128 _r0 = _mm_load_ps(pp);
                _mm_storeu_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[4 + 4] = pp[8];
                    p0[5 + 4] = pp[10];
                    p0[6 + 4] = pp[12];
                    p0[7 + 4] = pp[14];
                    p0[8 + 4] = pp[16];
                    p0[9 + 4] = pp[18];
                    p0[10 + 4] = pp[20];
                    p0[11 + 4] = pp[22];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    p0[20 + 4] = pp[9];
                    p0[21 + 4] = pp[11];
                    p0[22 + 4] = pp[13];
                    p0[23 + 4] = pp[15];
                    p0[24 + 4] = pp[17];
                    p0[25 + 4] = pp[19];
                    p0[26 + 4] = pp[21];
                    p0[27 + 4] = pp[23];
                    pp += 24;
                    jj += 12;
                }
                else
                {
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[4 + 8] = pp[8];
                    p0[5 + 8] = pp[10];
                    p0[6 + 8] = pp[12];
                    p0[7 + 8] = pp[14];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    p0[20 + 8] = pp[9];
                    p0[21 + 8] = pp[11];
                    p0[22 + 8] = pp[13];
                    p0[23 + 8] = pp[15];
                    pp += 16;
                    jj += 8;
                }
                else
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                p0[0 + 12] = pp[0];
                p0[1 + 12] = pp[2];
                p0[2 + 12] = pp[4];
                p0[3 + 12] = pp[6];
                p0[16 + 12] = pp[1];
                p0[17 + 12] = pp[3];
                p0[18 + 12] = pp[5];
                p0[19 + 12] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[12] = pp[24];
                p0[13] = pp[26];
                p0[14] = pp[28];
                p0[15] = pp[30];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                p0[28] = pp[25];
                p0[29] = pp[27];
                p0[30] = pp[29];
                p0[31] = pp[31];
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                pp += 24;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[2];
                p0[2 + 4] = pp[4];
                p0[3 + 4] = pp[6];
                p0[8 + 4] = pp[1];
                p0[9 + 4] = pp[3];
                p0[10 + 4] = pp[5];
                p0[11 + 4] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                p0[12] = pp[9];
                p0[13] = pp[11];
                p0[14] = pp[13];
                p0[15] = pp[15];
                pp += 16;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[1];
                p0[5] = pp[3];
                p0[6] = pp[5];
                p0[7] = pp[7];
                pp += 8;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                pp += 2;
                p0 += out_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    __m128 _r1 = _mm_loadu_ps(pp + 8);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 8, _r1);
                    pp += 12;
                    jj += 12;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_storeu_ps(p0 + 4, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    _mm256_store_ps(p0 + 8, _r0);
                    pp += 8;
                    jj += 8;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_store_ps(p0 + 8, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0 + 12, _r0);
                pp += 4;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(pp);
                _mm512_store_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                __m128 _r1 = _mm_loadu_ps(pp + 8);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                pp += 12;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[1];
                p0[2 + 4] = pp[2];
                p0[3 + 4] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                p0[2] = pp[2];
                p0[3] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                pp += 1;
                p0 += out_hstep;
            }
        }
    }
}